

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_h<embree::sse2::RibbonCurve1Intersector1<embree::HermiteCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  int iVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  RTCFilterFunctionN p_Var23;
  long lVar24;
  undefined8 uVar25;
  undefined6 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  RTCFilterFunctionN *pp_Var52;
  int iVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  undefined4 uVar57;
  ulong uVar58;
  RTCIntersectArguments *pRVar59;
  RTCIntersectArguments *pRVar60;
  undefined1 *puVar61;
  undefined1 auVar62 [8];
  bool bVar63;
  undefined1 auVar64 [8];
  Geometry *geometry;
  long lVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  short sVar72;
  float fVar73;
  float fVar106;
  float fVar107;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar108;
  float fVar125;
  float fVar126;
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar127;
  float fVar134;
  float fVar136;
  vfloat4 v;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar128;
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar139;
  float fVar140;
  float fVar152;
  float fVar154;
  vfloat4 v_1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar157;
  float fVar165;
  float fVar166;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar167;
  float fVar189;
  float fVar190;
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar191;
  float fVar195;
  float fVar196;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  float fVar206;
  float fVar207;
  float fVar210;
  float fVar211;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar212;
  float fVar218;
  float fVar219;
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar220;
  float fVar225;
  float fVar226;
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  float fVar227;
  float fVar228;
  float fVar237;
  float fVar240;
  float fVar243;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar238;
  float fVar239;
  float fVar241;
  float fVar242;
  float fVar244;
  float fVar245;
  undefined1 auVar236 [16];
  float fVar246;
  float fVar247;
  float fVar256;
  float fVar258;
  float fVar260;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar257;
  float fVar259;
  float fVar261;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar262;
  float fVar263;
  float fVar268;
  float fVar269;
  float fVar271;
  anon_struct_4_6_abad0318_for_Geometry_10 aVar272;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar270;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar273;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  ulong local_468;
  int local_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined8 local_3d8;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [4];
  undefined1 auStack_3b4 [12];
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  Ray *local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  ulong local_328;
  Precalculations *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [40];
  float local_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  anon_struct_4_6_abad0318_for_Geometry_10 aStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  float local_290;
  float local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  uint local_27c;
  uint local_278;
  ulong local_260;
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  uint local_128;
  int local_124;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  float local_c8 [4];
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8 [4];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 uVar104;
  undefined2 uVar105;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  
  PVar18 = prim[1];
  uVar54 = (ulong)(byte)PVar18;
  lVar24 = uVar54 * 0x25;
  pPVar7 = prim + lVar24 + 6;
  fVar136 = *(float *)(pPVar7 + 0xc);
  fVar139 = ((ray->org).field_0.m128[0] - *(float *)pPVar7) * fVar136;
  fVar152 = ((ray->org).field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar136;
  fVar154 = ((ray->org).field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar136;
  fVar127 = fVar136 * (ray->dir).field_0.m128[0];
  fVar134 = fVar136 * (ray->dir).field_0.m128[1];
  fVar136 = fVar136 * (ray->dir).field_0.m128[2];
  uVar57 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar56 = CONCAT62(uVar26,sVar72);
  auVar130._8_4_ = 0;
  auVar130._0_8_ = uVar56;
  auVar130._12_2_ = uVar105;
  auVar130._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar75._12_4_ = auVar130._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar56;
  auVar75._10_2_ = uVar105;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar105;
  auVar74._0_8_ = uVar56;
  uVar105 = (undefined2)uVar26;
  auVar27._4_8_ = auVar74._8_8_;
  auVar27._2_2_ = uVar105;
  auVar27._0_2_ = uVar105;
  fVar262 = (float)((int)sVar72 >> 8);
  fVar268 = (float)(auVar27._0_4_ >> 0x18);
  fVar269 = (float)(auVar74._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar56 = CONCAT62(uVar26,sVar72);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar56;
  auVar111._12_2_ = uVar105;
  auVar111._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar56;
  auVar110._10_2_ = uVar105;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar105;
  auVar109._0_8_ = uVar56;
  uVar105 = (undefined2)uVar26;
  auVar28._4_8_ = auVar109._8_8_;
  auVar28._2_2_ = uVar105;
  auVar28._0_2_ = uVar105;
  fVar157 = (float)((int)sVar72 >> 8);
  fVar165 = (float)(auVar28._0_4_ >> 0x18);
  fVar166 = (float)(auVar109._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar56 = CONCAT62(uVar26,sVar72);
  auVar114._8_4_ = 0;
  auVar114._0_8_ = uVar56;
  auVar114._12_2_ = uVar105;
  auVar114._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._8_2_ = 0;
  auVar113._0_8_ = uVar56;
  auVar113._10_2_ = uVar105;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._8_2_ = uVar105;
  auVar112._0_8_ = uVar56;
  uVar105 = (undefined2)uVar26;
  auVar29._4_8_ = auVar112._8_8_;
  auVar29._2_2_ = uVar105;
  auVar29._0_2_ = uVar105;
  fVar191 = (float)((int)sVar72 >> 8);
  fVar195 = (float)(auVar29._0_4_ >> 0x18);
  fVar196 = (float)(auVar112._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar56 = CONCAT62(uVar26,sVar72);
  auVar117._8_4_ = 0;
  auVar117._0_8_ = uVar56;
  auVar117._12_2_ = uVar105;
  auVar117._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._8_2_ = 0;
  auVar116._0_8_ = uVar56;
  auVar116._10_2_ = uVar105;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._8_2_ = uVar105;
  auVar115._0_8_ = uVar56;
  uVar105 = (undefined2)uVar26;
  auVar30._4_8_ = auVar115._8_8_;
  auVar30._2_2_ = uVar105;
  auVar30._0_2_ = uVar105;
  fVar73 = (float)((int)sVar72 >> 8);
  fVar106 = (float)(auVar30._0_4_ >> 0x18);
  fVar107 = (float)(auVar115._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar56 = CONCAT62(uVar26,sVar72);
  auVar170._8_4_ = 0;
  auVar170._0_8_ = uVar56;
  auVar170._12_2_ = uVar105;
  auVar170._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = uVar56;
  auVar169._10_2_ = uVar105;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._8_2_ = uVar105;
  auVar168._0_8_ = uVar56;
  uVar105 = (undefined2)uVar26;
  auVar31._4_8_ = auVar168._8_8_;
  auVar31._2_2_ = uVar105;
  auVar31._0_2_ = uVar105;
  fVar197 = (float)((int)sVar72 >> 8);
  fVar203 = (float)(auVar31._0_4_ >> 0x18);
  fVar204 = (float)(auVar168._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar54 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar56 = CONCAT62(uVar26,sVar72);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar56;
  auVar173._12_2_ = uVar105;
  auVar173._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar56;
  auVar172._10_2_ = uVar105;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar105;
  auVar171._0_8_ = uVar56;
  uVar105 = (undefined2)uVar26;
  auVar32._4_8_ = auVar171._8_8_;
  auVar32._2_2_ = uVar105;
  auVar32._0_2_ = uVar105;
  fVar212 = (float)((int)sVar72 >> 8);
  fVar218 = (float)(auVar32._0_4_ >> 0x18);
  fVar219 = (float)(auVar171._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar56 = CONCAT62(uVar26,sVar72);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar56;
  auVar176._12_2_ = uVar105;
  auVar176._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar56;
  auVar175._10_2_ = uVar105;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar105;
  auVar174._0_8_ = uVar56;
  uVar105 = (undefined2)uVar26;
  auVar33._4_8_ = auVar174._8_8_;
  auVar33._2_2_ = uVar105;
  auVar33._0_2_ = uVar105;
  fVar207 = (float)((int)sVar72 >> 8);
  fVar210 = (float)(auVar33._0_4_ >> 0x18);
  fVar211 = (float)(auVar174._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar56 = CONCAT62(uVar26,sVar72);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar56;
  auVar179._12_2_ = uVar105;
  auVar179._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar56;
  auVar178._10_2_ = uVar105;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar105;
  auVar177._0_8_ = uVar56;
  uVar105 = (undefined2)uVar26;
  auVar34._4_8_ = auVar177._8_8_;
  auVar34._2_2_ = uVar105;
  auVar34._0_2_ = uVar105;
  fVar220 = (float)((int)sVar72 >> 8);
  fVar225 = (float)(auVar34._0_4_ >> 0x18);
  fVar226 = (float)(auVar177._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar56 = CONCAT62(uVar26,sVar72);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar56;
  auVar182._12_2_ = uVar105;
  auVar182._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar56;
  auVar181._10_2_ = uVar105;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar105;
  auVar180._0_8_ = uVar56;
  uVar105 = (undefined2)uVar26;
  auVar35._4_8_ = auVar180._8_8_;
  auVar35._2_2_ = uVar105;
  auVar35._0_2_ = uVar105;
  fVar108 = (float)((int)sVar72 >> 8);
  fVar125 = (float)(auVar35._0_4_ >> 0x18);
  fVar126 = (float)(auVar180._8_4_ >> 0x18);
  fVar246 = fVar127 * fVar262 + fVar134 * fVar157 + fVar136 * fVar191;
  fVar256 = fVar127 * fVar268 + fVar134 * fVar165 + fVar136 * fVar195;
  fVar258 = fVar127 * fVar269 + fVar134 * fVar166 + fVar136 * fVar196;
  fVar260 = fVar127 * (float)(auVar75._12_4_ >> 0x18) +
            fVar134 * (float)(auVar110._12_4_ >> 0x18) + fVar136 * (float)(auVar113._12_4_ >> 0x18);
  fVar227 = fVar127 * fVar73 + fVar134 * fVar197 + fVar136 * fVar212;
  fVar237 = fVar127 * fVar106 + fVar134 * fVar203 + fVar136 * fVar218;
  fVar240 = fVar127 * fVar107 + fVar134 * fVar204 + fVar136 * fVar219;
  fVar243 = fVar127 * (float)(auVar116._12_4_ >> 0x18) +
            fVar134 * (float)(auVar169._12_4_ >> 0x18) + fVar136 * (float)(auVar172._12_4_ >> 0x18);
  fVar167 = fVar127 * fVar207 + fVar134 * fVar220 + fVar136 * fVar108;
  fVar189 = fVar127 * fVar210 + fVar134 * fVar225 + fVar136 * fVar125;
  fVar190 = fVar127 * fVar211 + fVar134 * fVar226 + fVar136 * fVar126;
  fVar127 = fVar127 * (float)(auVar175._12_4_ >> 0x18) +
            fVar134 * (float)(auVar178._12_4_ >> 0x18) + fVar136 * (float)(auVar181._12_4_ >> 0x18);
  fVar263 = fVar262 * fVar139 + fVar157 * fVar152 + fVar191 * fVar154;
  fVar268 = fVar268 * fVar139 + fVar165 * fVar152 + fVar195 * fVar154;
  fVar269 = fVar269 * fVar139 + fVar166 * fVar152 + fVar196 * fVar154;
  fVar271 = (float)(auVar75._12_4_ >> 0x18) * fVar139 +
            (float)(auVar110._12_4_ >> 0x18) * fVar152 + (float)(auVar113._12_4_ >> 0x18) * fVar154;
  fVar212 = fVar73 * fVar139 + fVar197 * fVar152 + fVar212 * fVar154;
  fVar218 = fVar106 * fVar139 + fVar203 * fVar152 + fVar218 * fVar154;
  fVar219 = fVar107 * fVar139 + fVar204 * fVar152 + fVar219 * fVar154;
  fVar262 = (float)(auVar116._12_4_ >> 0x18) * fVar139 +
            (float)(auVar169._12_4_ >> 0x18) * fVar152 + (float)(auVar172._12_4_ >> 0x18) * fVar154;
  fVar207 = fVar139 * fVar207 + fVar152 * fVar220 + fVar154 * fVar108;
  fVar210 = fVar139 * fVar210 + fVar152 * fVar225 + fVar154 * fVar125;
  fVar211 = fVar139 * fVar211 + fVar152 * fVar226 + fVar154 * fVar126;
  fVar220 = fVar139 * (float)(auVar175._12_4_ >> 0x18) +
            fVar152 * (float)(auVar178._12_4_ >> 0x18) + fVar154 * (float)(auVar181._12_4_ >> 0x18);
  fVar136 = (float)DAT_01f80d30;
  fVar73 = DAT_01f80d30._4_4_;
  fVar106 = DAT_01f80d30._8_4_;
  fVar107 = DAT_01f80d30._12_4_;
  uVar66 = -(uint)(fVar136 <= ABS(fVar246));
  uVar67 = -(uint)(fVar73 <= ABS(fVar256));
  uVar68 = -(uint)(fVar106 <= ABS(fVar258));
  uVar69 = -(uint)(fVar107 <= ABS(fVar260));
  auVar248._0_4_ = (uint)fVar246 & uVar66;
  auVar248._4_4_ = (uint)fVar256 & uVar67;
  auVar248._8_4_ = (uint)fVar258 & uVar68;
  auVar248._12_4_ = (uint)fVar260 & uVar69;
  auVar141._0_4_ = ~uVar66 & (uint)fVar136;
  auVar141._4_4_ = ~uVar67 & (uint)fVar73;
  auVar141._8_4_ = ~uVar68 & (uint)fVar106;
  auVar141._12_4_ = ~uVar69 & (uint)fVar107;
  auVar141 = auVar141 | auVar248;
  uVar66 = -(uint)(fVar136 <= ABS(fVar227));
  uVar67 = -(uint)(fVar73 <= ABS(fVar237));
  uVar68 = -(uint)(fVar106 <= ABS(fVar240));
  uVar69 = -(uint)(fVar107 <= ABS(fVar243));
  auVar229._0_4_ = (uint)fVar227 & uVar66;
  auVar229._4_4_ = (uint)fVar237 & uVar67;
  auVar229._8_4_ = (uint)fVar240 & uVar68;
  auVar229._12_4_ = (uint)fVar243 & uVar69;
  auVar192._0_4_ = ~uVar66 & (uint)fVar136;
  auVar192._4_4_ = ~uVar67 & (uint)fVar73;
  auVar192._8_4_ = ~uVar68 & (uint)fVar106;
  auVar192._12_4_ = ~uVar69 & (uint)fVar107;
  auVar192 = auVar192 | auVar229;
  uVar66 = -(uint)(fVar136 <= ABS(fVar167));
  uVar67 = -(uint)(fVar73 <= ABS(fVar189));
  uVar68 = -(uint)(fVar106 <= ABS(fVar190));
  uVar69 = -(uint)(fVar107 <= ABS(fVar127));
  auVar183._0_4_ = (uint)fVar167 & uVar66;
  auVar183._4_4_ = (uint)fVar189 & uVar67;
  auVar183._8_4_ = (uint)fVar190 & uVar68;
  auVar183._12_4_ = (uint)fVar127 & uVar69;
  auVar198._0_4_ = ~uVar66 & (uint)fVar136;
  auVar198._4_4_ = ~uVar67 & (uint)fVar73;
  auVar198._8_4_ = ~uVar68 & (uint)fVar106;
  auVar198._12_4_ = ~uVar69 & (uint)fVar107;
  auVar198 = auVar198 | auVar183;
  auVar75 = rcpps(_DAT_01f80d30,auVar141);
  fVar136 = auVar75._0_4_;
  fVar107 = auVar75._4_4_;
  fVar157 = auVar75._8_4_;
  fVar197 = auVar75._12_4_;
  fVar136 = (1.0 - auVar141._0_4_ * fVar136) * fVar136 + fVar136;
  fVar107 = (1.0 - auVar141._4_4_ * fVar107) * fVar107 + fVar107;
  fVar157 = (1.0 - auVar141._8_4_ * fVar157) * fVar157 + fVar157;
  fVar197 = (1.0 - auVar141._12_4_ * fVar197) * fVar197 + fVar197;
  auVar75 = rcpps(auVar75,auVar192);
  fVar73 = auVar75._0_4_;
  fVar108 = auVar75._4_4_;
  fVar165 = auVar75._8_4_;
  fVar203 = auVar75._12_4_;
  fVar73 = (1.0 - auVar192._0_4_ * fVar73) * fVar73 + fVar73;
  fVar108 = (1.0 - auVar192._4_4_ * fVar108) * fVar108 + fVar108;
  fVar165 = (1.0 - auVar192._8_4_ * fVar165) * fVar165 + fVar165;
  fVar203 = (1.0 - auVar192._12_4_ * fVar203) * fVar203 + fVar203;
  auVar75 = rcpps(auVar75,auVar198);
  fVar106 = auVar75._0_4_;
  fVar125 = auVar75._4_4_;
  fVar166 = auVar75._8_4_;
  fVar204 = auVar75._12_4_;
  fVar106 = (1.0 - auVar198._0_4_ * fVar106) * fVar106 + fVar106;
  fVar125 = (1.0 - auVar198._4_4_ * fVar125) * fVar125 + fVar125;
  fVar166 = (1.0 - auVar198._8_4_ * fVar166) * fVar166 + fVar166;
  fVar204 = (1.0 - auVar198._12_4_ * fVar204) * fVar204 + fVar204;
  fVar225 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  uVar56 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar105 = (undefined2)(uVar56 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar56;
  auVar78._12_2_ = uVar105;
  auVar78._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar56 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar56;
  auVar77._10_2_ = uVar105;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar105;
  auVar76._0_8_ = uVar56;
  uVar105 = (undefined2)(uVar56 >> 0x10);
  auVar36._4_8_ = auVar76._8_8_;
  auVar36._2_2_ = uVar105;
  auVar36._0_2_ = uVar105;
  fVar126 = (float)(auVar36._0_4_ >> 0x10);
  fVar167 = (float)(auVar76._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar105 = (undefined2)(uVar9 >> 0x30);
  auVar144._8_4_ = 0;
  auVar144._0_8_ = uVar9;
  auVar144._12_2_ = uVar105;
  auVar144._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar9 >> 0x20);
  auVar143._12_4_ = auVar144._12_4_;
  auVar143._8_2_ = 0;
  auVar143._0_8_ = uVar9;
  auVar143._10_2_ = uVar105;
  auVar142._10_6_ = auVar143._10_6_;
  auVar142._8_2_ = uVar105;
  auVar142._0_8_ = uVar9;
  uVar105 = (undefined2)(uVar9 >> 0x10);
  auVar37._4_8_ = auVar142._8_8_;
  auVar37._2_2_ = uVar105;
  auVar37._0_2_ = uVar105;
  uVar10 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar105 = (undefined2)(uVar10 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar10;
  auVar81._12_2_ = uVar105;
  auVar81._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar10 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar10;
  auVar80._10_2_ = uVar105;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar105;
  auVar79._0_8_ = uVar10;
  uVar105 = (undefined2)(uVar10 >> 0x10);
  auVar38._4_8_ = auVar79._8_8_;
  auVar38._2_2_ = uVar105;
  auVar38._0_2_ = uVar105;
  fVar127 = (float)(auVar38._0_4_ >> 0x10);
  fVar189 = (float)(auVar79._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar105 = (undefined2)(uVar11 >> 0x30);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar11;
  auVar201._12_2_ = uVar105;
  auVar201._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar11 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar11;
  auVar200._10_2_ = uVar105;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar105;
  auVar199._0_8_ = uVar11;
  uVar105 = (undefined2)(uVar11 >> 0x10);
  auVar39._4_8_ = auVar199._8_8_;
  auVar39._2_2_ = uVar105;
  auVar39._0_2_ = uVar105;
  uVar12 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar105 = (undefined2)(uVar12 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar12;
  auVar84._12_2_ = uVar105;
  auVar84._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar12 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar12;
  auVar83._10_2_ = uVar105;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar105;
  auVar82._0_8_ = uVar12;
  uVar105 = (undefined2)(uVar12 >> 0x10);
  auVar40._4_8_ = auVar82._8_8_;
  auVar40._2_2_ = uVar105;
  auVar40._0_2_ = uVar105;
  fVar134 = (float)(auVar40._0_4_ >> 0x10);
  fVar190 = (float)(auVar82._8_4_ >> 0x10);
  uVar58 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar54 * 2 + uVar58 + 6);
  uVar105 = (undefined2)(uVar13 >> 0x30);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar13;
  auVar215._12_2_ = uVar105;
  auVar215._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar13 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar13;
  auVar214._10_2_ = uVar105;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar105;
  auVar213._0_8_ = uVar13;
  uVar105 = (undefined2)(uVar13 >> 0x10);
  auVar41._4_8_ = auVar213._8_8_;
  auVar41._2_2_ = uVar105;
  auVar41._0_2_ = uVar105;
  uVar58 = *(ulong *)(prim + uVar58 + 6);
  uVar105 = (undefined2)(uVar58 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar58;
  auVar87._12_2_ = uVar105;
  auVar87._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar58 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar58;
  auVar86._10_2_ = uVar105;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar105;
  auVar85._0_8_ = uVar58;
  uVar105 = (undefined2)(uVar58 >> 0x10);
  auVar42._4_8_ = auVar85._8_8_;
  auVar42._2_2_ = uVar105;
  auVar42._0_2_ = uVar105;
  fVar139 = (float)(auVar42._0_4_ >> 0x10);
  fVar191 = (float)(auVar85._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar105 = (undefined2)(uVar14 >> 0x30);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar14;
  auVar223._12_2_ = uVar105;
  auVar223._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar14 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar14;
  auVar222._10_2_ = uVar105;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar105;
  auVar221._0_8_ = uVar14;
  uVar105 = (undefined2)(uVar14 >> 0x10);
  auVar43._4_8_ = auVar221._8_8_;
  auVar43._2_2_ = uVar105;
  auVar43._0_2_ = uVar105;
  uVar15 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar105 = (undefined2)(uVar15 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar15;
  auVar90._12_2_ = uVar105;
  auVar90._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar15 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar15;
  auVar89._10_2_ = uVar105;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar105;
  auVar88._0_8_ = uVar15;
  uVar105 = (undefined2)(uVar15 >> 0x10);
  auVar44._4_8_ = auVar88._8_8_;
  auVar44._2_2_ = uVar105;
  auVar44._0_2_ = uVar105;
  fVar152 = (float)(auVar44._0_4_ >> 0x10);
  fVar195 = (float)(auVar88._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar105 = (undefined2)(uVar16 >> 0x30);
  auVar232._8_4_ = 0;
  auVar232._0_8_ = uVar16;
  auVar232._12_2_ = uVar105;
  auVar232._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar16 >> 0x20);
  auVar231._12_4_ = auVar232._12_4_;
  auVar231._8_2_ = 0;
  auVar231._0_8_ = uVar16;
  auVar231._10_2_ = uVar105;
  auVar230._10_6_ = auVar231._10_6_;
  auVar230._8_2_ = uVar105;
  auVar230._0_8_ = uVar16;
  uVar105 = (undefined2)(uVar16 >> 0x10);
  auVar45._4_8_ = auVar230._8_8_;
  auVar45._2_2_ = uVar105;
  auVar45._0_2_ = uVar105;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar54) + 6);
  uVar105 = (undefined2)(uVar17 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar17;
  auVar93._12_2_ = uVar105;
  auVar93._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar17 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar17;
  auVar92._10_2_ = uVar105;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar105;
  auVar91._0_8_ = uVar17;
  uVar105 = (undefined2)(uVar17 >> 0x10);
  auVar46._4_8_ = auVar91._8_8_;
  auVar46._2_2_ = uVar105;
  auVar46._0_2_ = uVar105;
  fVar154 = (float)(auVar46._0_4_ >> 0x10);
  fVar196 = (float)(auVar91._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar105 = (undefined2)(uVar54 >> 0x30);
  auVar251._8_4_ = 0;
  auVar251._0_8_ = uVar54;
  auVar251._12_2_ = uVar105;
  auVar251._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar54 >> 0x20);
  auVar250._12_4_ = auVar251._12_4_;
  auVar250._8_2_ = 0;
  auVar250._0_8_ = uVar54;
  auVar250._10_2_ = uVar105;
  auVar249._10_6_ = auVar250._10_6_;
  auVar249._8_2_ = uVar105;
  auVar249._0_8_ = uVar54;
  uVar105 = (undefined2)(uVar54 >> 0x10);
  auVar47._4_8_ = auVar249._8_8_;
  auVar47._2_2_ = uVar105;
  auVar47._0_2_ = uVar105;
  auVar145._0_8_ =
       CONCAT44(((((float)(auVar37._0_4_ >> 0x10) - fVar126) * fVar225 + fVar126) - fVar268) *
                fVar107,((((float)(int)(short)uVar9 - (float)(int)(short)uVar56) * fVar225 +
                         (float)(int)(short)uVar56) - fVar263) * fVar136);
  auVar145._8_4_ =
       ((((float)(auVar142._8_4_ >> 0x10) - fVar167) * fVar225 + fVar167) - fVar269) * fVar157;
  auVar145._12_4_ =
       ((((float)(auVar143._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar225 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar271) * fVar197;
  auVar202._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar225 +
        (float)(int)(short)uVar10) - fVar263) * fVar136;
  auVar202._4_4_ =
       ((((float)(auVar39._0_4_ >> 0x10) - fVar127) * fVar225 + fVar127) - fVar268) * fVar107;
  auVar202._8_4_ =
       ((((float)(auVar199._8_4_ >> 0x10) - fVar189) * fVar225 + fVar189) - fVar269) * fVar157;
  auVar202._12_4_ =
       ((((float)(auVar200._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar225 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar271) * fVar197;
  auVar216._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar134) * fVar225 + fVar134) - fVar218) *
                fVar108,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar225 +
                         (float)(int)(short)uVar12) - fVar212) * fVar73);
  auVar216._8_4_ =
       ((((float)(auVar213._8_4_ >> 0x10) - fVar190) * fVar225 + fVar190) - fVar219) * fVar165;
  auVar216._12_4_ =
       ((((float)(auVar214._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar225 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar262) * fVar203;
  auVar224._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar58) * fVar225 +
        (float)(int)(short)uVar58) - fVar212) * fVar73;
  auVar224._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar139) * fVar225 + fVar139) - fVar218) * fVar108;
  auVar224._8_4_ =
       ((((float)(auVar221._8_4_ >> 0x10) - fVar191) * fVar225 + fVar191) - fVar219) * fVar165;
  auVar224._12_4_ =
       ((((float)(auVar222._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar225 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar262) * fVar203;
  auVar233._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar152) * fVar225 + fVar152) - fVar210) *
                fVar125,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar225 +
                         (float)(int)(short)uVar15) - fVar207) * fVar106);
  auVar233._8_4_ =
       ((((float)(auVar230._8_4_ >> 0x10) - fVar195) * fVar225 + fVar195) - fVar211) * fVar166;
  auVar233._12_4_ =
       ((((float)(auVar231._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar225 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar220) * fVar204;
  auVar252._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar17) * fVar225 +
        (float)(int)(short)uVar17) - fVar207) * fVar106;
  auVar252._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar154) * fVar225 + fVar154) - fVar210) * fVar125;
  auVar252._8_4_ =
       ((((float)(auVar249._8_4_ >> 0x10) - fVar196) * fVar225 + fVar196) - fVar211) * fVar166;
  auVar252._12_4_ =
       ((((float)(auVar250._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar225 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar220) * fVar204;
  auVar129._8_4_ = auVar145._8_4_;
  auVar129._0_8_ = auVar145._0_8_;
  auVar129._12_4_ = auVar145._12_4_;
  auVar130 = minps(auVar129,auVar202);
  auVar94._8_4_ = auVar216._8_4_;
  auVar94._0_8_ = auVar216._0_8_;
  auVar94._12_4_ = auVar216._12_4_;
  auVar75 = minps(auVar94,auVar224);
  auVar130 = maxps(auVar130,auVar75);
  auVar95._8_4_ = auVar233._8_4_;
  auVar95._0_8_ = auVar233._0_8_;
  auVar95._12_4_ = auVar233._12_4_;
  auVar75 = minps(auVar95,auVar252);
  uVar57 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar118._4_4_ = uVar57;
  auVar118._0_4_ = uVar57;
  auVar118._8_4_ = uVar57;
  auVar118._12_4_ = uVar57;
  auVar75 = maxps(auVar75,auVar118);
  auVar75 = maxps(auVar130,auVar75);
  local_48 = auVar75._0_4_ * 0.99999964;
  fStack_44 = auVar75._4_4_ * 0.99999964;
  fStack_40 = auVar75._8_4_ * 0.99999964;
  fStack_3c = auVar75._12_4_ * 0.99999964;
  auVar75 = maxps(auVar145,auVar202);
  auVar130 = maxps(auVar216,auVar224);
  auVar75 = minps(auVar75,auVar130);
  auVar130 = maxps(auVar233,auVar252);
  fVar136 = ray->tfar;
  auVar96._4_4_ = fVar136;
  auVar96._0_4_ = fVar136;
  auVar96._8_4_ = fVar136;
  auVar96._12_4_ = fVar136;
  auVar130 = minps(auVar130,auVar96);
  auVar75 = minps(auVar75,auVar130);
  uVar66 = (uint)(byte)PVar18;
  auVar119._0_4_ = -(uint)(uVar66 != 0 && local_48 <= auVar75._0_4_ * 1.0000004);
  auVar119._4_4_ = -(uint)(1 < uVar66 && fStack_44 <= auVar75._4_4_ * 1.0000004);
  auVar119._8_4_ = -(uint)(2 < uVar66 && fStack_40 <= auVar75._8_4_ * 1.0000004);
  auVar119._12_4_ = -(uint)(3 < uVar66 && fStack_3c <= auVar75._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar119);
  if (uVar66 != 0) {
    uVar66 = uVar66 & 0xff;
    local_318 = mm_lookupmask_ps._0_8_;
    uStack_310 = mm_lookupmask_ps._8_8_;
    local_390 = ray;
    local_320 = pre;
    do {
      lVar24 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      local_328 = (ulong)*(uint *)(prim + 2);
      local_260 = (ulong)*(uint *)(prim + lVar24 * 4 + 6);
      pGVar20 = (context->scene->geometries).items[local_328].ptr;
      uVar56 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                               local_260 *
                               pGVar20[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar136 = pGVar20->fnumTimeSegments;
      fVar73 = (pGVar20->time_range).lower;
      fVar106 = (((ray->dir).field_0.m128[3] - fVar73) / ((pGVar20->time_range).upper - fVar73)) *
                fVar136;
      fVar73 = floorf(fVar106);
      fVar136 = fVar136 + -1.0;
      if (fVar136 <= fVar73) {
        fVar73 = fVar136;
      }
      fVar136 = 0.0;
      if (0.0 <= fVar73) {
        fVar136 = fVar73;
      }
      _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar55 = (long)(int)fVar136 * 0x38;
      lVar24 = *(long *)(_Var21 + 0x10 + lVar55);
      lVar65 = *(long *)(_Var21 + 0x38 + lVar55);
      lVar22 = *(long *)(_Var21 + 0x48 + lVar55);
      pfVar1 = (float *)(lVar65 + lVar22 * uVar56);
      auVar64 = (undefined1  [8])(uVar56 + 1);
      pfVar2 = (float *)(lVar65 + lVar22 * (long)auVar64);
      p_Var23 = pGVar20[4].occlusionFilterN;
      pfVar3 = (float *)(*(long *)(_Var21 + lVar55) + lVar24 * uVar56);
      pfVar4 = (float *)(*(long *)(_Var21 + lVar55) + lVar24 * (long)auVar64);
      pfVar5 = (float *)(*(long *)(p_Var23 + lVar55 + 0x38) +
                        uVar56 * *(long *)(p_Var23 + lVar55 + 0x48));
      fVar106 = fVar106 - fVar136;
      fVar136 = 1.0 - fVar106;
      pfVar6 = (float *)(*(long *)(p_Var23 + lVar55 + 0x38) +
                        *(long *)(p_Var23 + lVar55 + 0x48) * (long)auVar64);
      local_2b8 = *pfVar3 * fVar136 + *pfVar1 * fVar106;
      fStack_2b4 = pfVar3[1] * fVar136 + pfVar1[1] * fVar106;
      fStack_2b0 = pfVar3[2] * fVar136 + pfVar1[2] * fVar106;
      fStack_2ac = pfVar3[3] * fVar136 + pfVar1[3] * fVar106;
      pfVar1 = (float *)(*(long *)(p_Var23 + lVar55) + *(long *)(p_Var23 + lVar55 + 0x10) * uVar56);
      local_228 = *pfVar4 * fVar136 + *pfVar2 * fVar106;
      fStack_224 = pfVar4[1] * fVar136 + pfVar2[1] * fVar106;
      fStack_220 = pfVar4[2] * fVar136 + pfVar2[2] * fVar106;
      fStack_21c = pfVar4[3] * fVar136 + pfVar2[3] * fVar106;
      pfVar2 = (float *)(*(long *)(p_Var23 + lVar55) +
                        *(long *)(p_Var23 + lVar55 + 0x10) * (long)auVar64);
      local_238 = (*pfVar1 * fVar136 + *pfVar5 * fVar106) * 0.33333334 + local_2b8;
      fStack_234 = (pfVar1[1] * fVar136 + pfVar5[1] * fVar106) * 0.33333334 + fStack_2b4;
      fStack_230 = (pfVar1[2] * fVar136 + pfVar5[2] * fVar106) * 0.33333334 + fStack_2b0;
      fStack_22c = (pfVar1[3] * fVar136 + pfVar5[3] * fVar106) * 0.33333334 + fStack_2ac;
      local_248 = local_228 - (fVar136 * *pfVar2 + fVar106 * *pfVar6) * 0.33333334;
      fStack_244 = fStack_224 - (fVar136 * pfVar2[1] + fVar106 * pfVar6[1]) * 0.33333334;
      fStack_240 = fStack_220 - (fVar136 * pfVar2[2] + fVar106 * pfVar6[2]) * 0.33333334;
      fStack_23c = fStack_21c - (fVar136 * pfVar2[3] + fVar106 * pfVar6[3]) * 0.33333334;
      local_208 = (local_390->org).field_0.m128[0];
      fStack_204 = (local_390->org).field_0.m128[1];
      fStack_200 = (local_390->org).field_0.m128[2];
      fStack_1fc = (local_390->org).field_0.m128[3];
      fVar157 = local_2b8 - local_208;
      fVar165 = fStack_2b4 - fStack_204;
      fVar166 = fStack_2b0 - fStack_200;
      fVar136 = (local_320->ray_space).vx.field_0.m128[0];
      fVar73 = (local_320->ray_space).vx.field_0.m128[1];
      fVar106 = (local_320->ray_space).vx.field_0.m128[2];
      fVar107 = (local_320->ray_space).vx.field_0.m128[3];
      fVar108 = (local_320->ray_space).vy.field_0.m128[0];
      fVar125 = (local_320->ray_space).vy.field_0.m128[1];
      fVar126 = (local_320->ray_space).vy.field_0.m128[2];
      fVar127 = (local_320->ray_space).vy.field_0.m128[3];
      fVar134 = (local_320->ray_space).vz.field_0.m128[0];
      fVar139 = (local_320->ray_space).vz.field_0.m128[1];
      fVar152 = (local_320->ray_space).vz.field_0.m128[2];
      fVar154 = (local_320->ray_space).vz.field_0.m128[3];
      local_1e8 = fVar157 * fVar136 + fVar165 * fVar108 + fVar166 * fVar134;
      local_198 = fVar157 * fVar73 + fVar165 * fVar125 + fVar166 * fVar139;
      fVar167 = fVar157 * fVar106 + fVar165 * fVar126 + fVar166 * fVar152;
      fVar157 = local_238 - local_208;
      fVar165 = fStack_234 - fStack_204;
      fVar166 = fStack_230 - fStack_200;
      local_1f8 = fVar157 * fVar136 + fVar165 * fVar108 + fVar166 * fVar134;
      local_2a8 = fVar157 * fVar73 + fVar165 * fVar125 + fVar166 * fVar139;
      fVar189 = fVar157 * fVar106 + fVar165 * fVar126 + fVar166 * fVar152;
      fVar157 = local_248 - local_208;
      fVar165 = fStack_244 - fStack_204;
      fVar166 = fStack_240 - fStack_200;
      local_378 = fVar157 * fVar136 + fVar165 * fVar108 + fVar166 * fVar134;
      fVar190 = fVar157 * fVar73 + fVar165 * fVar125 + fVar166 * fVar139;
      fStack_3a0 = fVar157 * fVar106 + fVar165 * fVar126 + fVar166 * fVar152;
      fStack_39c = fVar157 * fVar107 + fVar165 * fVar127 + fVar166 * fVar154;
      fVar157 = local_228 - local_208;
      fVar165 = fStack_224 - fStack_204;
      fVar166 = fStack_220 - fStack_200;
      iVar19 = (int)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_3c8 = fVar157 * fVar136 + fVar165 * fVar108 + fVar166 * fVar134;
      fVar73 = fVar157 * fVar73 + fVar165 * fVar125 + fVar166 * fVar139;
      fStack_380 = fVar157 * fVar106 + fVar165 * fVar126 + fVar166 * fVar152;
      fStack_37c = fVar157 * fVar107 + fVar165 * fVar127 + fVar166 * fVar154;
      auVar234._0_8_ = CONCAT44(local_198,local_1e8) & 0x7fffffff7fffffff;
      auVar234._8_4_ = ABS(fVar167);
      auVar234._12_4_ = ABS(fStack_2ac);
      auVar146._0_8_ = CONCAT44(local_2a8,local_1f8) & 0x7fffffff7fffffff;
      auVar146._8_4_ = ABS(fVar189);
      auVar146._12_4_ = ABS(fStack_22c);
      auVar130 = maxps(auVar234,auVar146);
      auVar158._0_8_ = CONCAT44(fVar190,local_378) & 0x7fffffff7fffffff;
      auVar158._8_4_ = ABS(fStack_3a0);
      auVar158._12_4_ = ABS(fStack_23c);
      auVar120._0_8_ = CONCAT44(fVar73,local_3c8) & 0x7fffffff7fffffff;
      auVar120._8_4_ = ABS(fStack_380);
      auVar120._12_4_ = ABS(fStack_21c);
      auVar75 = maxps(auVar158,auVar120);
      auVar75 = maxps(auVar130,auVar75);
      fVar136 = auVar75._4_4_;
      if (auVar75._4_4_ <= auVar75._0_4_) {
        fVar136 = auVar75._0_4_;
      }
      fVar106 = (float)iVar19;
      auVar235._8_8_ = auVar75._8_8_;
      auVar235._0_8_ = auVar75._8_8_;
      if (auVar75._8_4_ <= fVar136) {
        auVar235._0_4_ = fVar136;
      }
      local_258 = ZEXT416((uint)fVar106);
      fStack_3d0 = (float)-(uint)(2.0 < fVar106);
      fStack_3cc = (float)-(uint)(3.0 < fVar106);
      local_3d8 = CONCAT44(-(uint)(1.0 < fVar106),-(uint)(0.0 < fVar106));
      pRVar59 = (RTCIntersectArguments *)((long)iVar19 * 0x40);
      lVar24 = (long)iVar19 * 0x44;
      fStack_374 = local_378;
      fStack_370 = local_378;
      fStack_36c = local_378;
      pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar24 + 0xd8c);
      fVar136 = *(float *)*pauVar8;
      fVar107 = *(float *)(bezier_basis0 + lVar24 + 0xd90);
      fVar108 = *(float *)(bezier_basis0 + lVar24 + 0xd94);
      auVar27 = *(undefined1 (*) [12])*pauVar8;
      fVar125 = *(float *)(bezier_basis0 + lVar24 + 0xd98);
      _local_3e8 = *pauVar8;
      fStack_3c4 = local_3c8;
      fStack_3c0 = local_3c8;
      fStack_3bc = local_3c8;
      pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar24 + 0x908);
      fVar126 = *(float *)*pauVar8;
      fVar127 = *(float *)(bezier_basis0 + lVar24 + 0x90c);
      fVar134 = *(float *)(bezier_basis0 + lVar24 + 0x910);
      auVar28 = *(undefined1 (*) [12])*pauVar8;
      fVar139 = *(float *)(bezier_basis0 + lVar24 + 0x914);
      _local_3b8 = *pauVar8;
      fStack_1f4 = local_1f8;
      fStack_1f0 = local_1f8;
      fStack_1ec = local_1f8;
      pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar24 + 0x484);
      fVar152 = *(float *)*pauVar8;
      fVar154 = *(float *)(bezier_basis0 + lVar24 + 0x488);
      fVar157 = *(float *)(bezier_basis0 + lVar24 + 0x48c);
      auVar29 = *(undefined1 (*) [12])*pauVar8;
      fVar165 = *(float *)(bezier_basis0 + lVar24 + 0x490);
      _local_358 = *pauVar8;
      local_368 = *(float *)(bezier_basis0 + lVar24);
      fStack_364 = *(float *)(bezier_basis0 + lVar24 + 4);
      fStack_360 = *(float *)(bezier_basis0 + lVar24 + 8);
      fStack_35c = *(float *)(bezier_basis0 + lVar24 + 0xc);
      local_1a8 = local_1e8 * local_368 +
                  local_1f8 * fVar152 + local_378 * fVar126 + local_3c8 * fVar136;
      fStack_1a4 = local_1e8 * fStack_364 +
                   local_1f8 * fVar154 + local_378 * fVar127 + local_3c8 * fVar107;
      fStack_1a0 = local_1e8 * fStack_360 +
                   local_1f8 * fVar157 + local_378 * fVar134 + local_3c8 * fVar108;
      fStack_19c = local_1e8 * fStack_35c +
                   local_1f8 * fVar165 + local_378 * fVar139 + local_3c8 * fVar125;
      local_1b8 = local_198 * local_368 + local_2a8 * fVar152 + fVar190 * fVar126 + fVar73 * fVar136
      ;
      fStack_1b4 = local_198 * fStack_364 +
                   local_2a8 * fVar154 + fVar190 * fVar127 + fVar73 * fVar107;
      fStack_1b0 = local_198 * fStack_360 +
                   local_2a8 * fVar157 + fVar190 * fVar134 + fVar73 * fVar108;
      fStack_1ac = local_198 * fStack_35c +
                   local_2a8 * fVar165 + fVar190 * fVar139 + fVar73 * fVar125;
      fVar220 = fStack_2ac * local_368 +
                fStack_22c * fVar152 + fStack_23c * fVar126 + fStack_21c * fVar136;
      fVar226 = fStack_2ac * fStack_364 +
                fStack_22c * fVar154 + fStack_23c * fVar127 + fStack_21c * fVar107;
      auVar184._0_8_ = CONCAT44(fVar226,fVar220);
      auVar184._8_4_ =
           fStack_2ac * fStack_360 +
           fStack_22c * fVar157 + fStack_23c * fVar134 + fStack_21c * fVar108;
      auVar184._12_4_ =
           fStack_2ac * fStack_35c +
           fStack_22c * fVar165 + fStack_23c * fVar139 + fStack_21c * fVar125;
      fVar136 = *(float *)(bezier_basis1 + lVar24 + 0xd8c);
      fVar107 = *(float *)(bezier_basis1 + lVar24 + 0xd90);
      fVar108 = *(float *)(bezier_basis1 + lVar24 + 0xd94);
      fVar126 = *(float *)(bezier_basis1 + lVar24 + 0xd98);
      local_2c8 = *(float *)(bezier_basis1 + lVar24 + 0x908);
      fStack_2c4 = *(float *)(bezier_basis1 + lVar24 + 0x90c);
      fStack_2c0 = *(float *)(bezier_basis1 + lVar24 + 0x910);
      aStack_2bc = *(anon_struct_4_6_abad0318_for_Geometry_10 *)(bezier_basis1 + lVar24 + 0x914);
      local_58 = fStack_21c;
      fStack_54 = fStack_21c;
      fStack_50 = fStack_21c;
      fStack_4c = fStack_21c;
      local_168 = fStack_23c;
      fStack_164 = fStack_23c;
      fStack_160 = fStack_23c;
      fStack_15c = fStack_23c;
      fVar127 = *(float *)(bezier_basis1 + lVar24 + 0x484);
      fVar134 = *(float *)(bezier_basis1 + lVar24 + 0x488);
      fVar152 = *(float *)(bezier_basis1 + lVar24 + 0x48c);
      fVar154 = *(float *)(bezier_basis1 + lVar24 + 0x490);
      fStack_2a4 = local_2a8;
      fStack_2a0 = local_2a8;
      fStack_29c = local_2a8;
      local_178 = fStack_22c;
      fStack_174 = fStack_22c;
      fStack_170 = fStack_22c;
      fStack_16c = fStack_22c;
      fVar157 = *(float *)(bezier_basis1 + lVar24);
      fVar166 = *(float *)(bezier_basis1 + lVar24 + 4);
      fVar191 = *(float *)(bezier_basis1 + lVar24 + 8);
      fVar195 = *(float *)(bezier_basis1 + lVar24 + 0xc);
      fStack_1e4 = local_1e8;
      fStack_1e0 = local_1e8;
      fStack_1dc = local_1e8;
      local_218._0_4_ =
           local_1e8 * fVar157 + local_1f8 * fVar127 + local_378 * local_2c8 + local_3c8 * fVar136;
      local_218._4_4_ =
           local_1e8 * fVar166 + local_1f8 * fVar134 + local_378 * fStack_2c4 + local_3c8 * fVar107;
      fStack_210 = local_1e8 * fVar191 +
                   local_1f8 * fVar152 + local_378 * fStack_2c0 + local_3c8 * fVar108;
      fStack_20c = local_1e8 * fVar195 +
                   local_1f8 * fVar154 + local_378 * (float)aStack_2bc + local_3c8 * fVar126;
      fStack_194 = local_198;
      fStack_190 = local_198;
      fStack_18c = local_198;
      fVar219 = local_198 * fVar157 + local_2a8 * fVar127 + fVar190 * local_2c8 + fVar73 * fVar136;
      fVar262 = local_198 * fVar166 + local_2a8 * fVar134 + fVar190 * fStack_2c4 + fVar73 * fVar107;
      fVar207 = local_198 * fVar191 + local_2a8 * fVar152 + fVar190 * fStack_2c0 + fVar73 * fVar108;
      fVar210 = local_198 * fVar195 +
                local_2a8 * fVar154 + fVar190 * (float)aStack_2bc + fVar73 * fVar126;
      local_188 = fStack_2ac;
      fStack_184 = fStack_2ac;
      fStack_180 = fStack_2ac;
      fStack_17c = fStack_2ac;
      auVar217._0_4_ =
           fStack_2ac * fVar157 +
           fStack_22c * fVar127 + fStack_23c * local_2c8 + fStack_21c * fVar136;
      auVar217._4_4_ =
           fStack_2ac * fVar166 +
           fStack_22c * fVar134 + fStack_23c * fStack_2c4 + fStack_21c * fVar107;
      auVar217._8_4_ =
           fStack_2ac * fVar191 +
           fStack_22c * fVar152 + fStack_23c * fStack_2c0 + fStack_21c * fVar108;
      auVar217._12_4_ =
           fStack_2ac * fVar195 +
           fStack_22c * fVar154 + fStack_23c * (float)aStack_2bc + fStack_21c * fVar126;
      fVar240 = (float)local_218._0_4_ - local_1a8;
      fVar243 = (float)local_218._4_4_ - fStack_1a4;
      fVar246 = fStack_210 - fStack_1a0;
      aVar272 = (anon_struct_4_6_abad0318_for_Geometry_10)(fStack_20c - fStack_19c);
      fVar211 = fVar219 - local_1b8;
      fVar225 = fVar262 - fStack_1b4;
      fVar227 = fVar207 - fStack_1b0;
      fVar237 = fVar210 - fStack_1ac;
      fVar196 = local_1b8 * fVar240 - local_1a8 * fVar211;
      fVar197 = fStack_1b4 * fVar243 - fStack_1a4 * fVar225;
      fVar203 = fStack_1b0 * fVar246 - fStack_1a0 * fVar227;
      fVar204 = fStack_1ac * (float)aVar272 - fStack_19c * fVar237;
      auVar208._8_4_ = auVar184._8_4_;
      auVar208._0_8_ = auVar184._0_8_;
      auVar208._12_4_ = auVar184._12_4_;
      auVar75 = maxps(auVar208,auVar217);
      bVar63 = fVar196 * fVar196 <=
               auVar75._0_4_ * auVar75._0_4_ * (fVar240 * fVar240 + fVar211 * fVar211) &&
               0.0 < fVar106;
      auVar147._0_4_ = -(uint)bVar63;
      bVar48 = fVar197 * fVar197 <=
               auVar75._4_4_ * auVar75._4_4_ * (fVar243 * fVar243 + fVar225 * fVar225) &&
               1.0 < fVar106;
      auVar147._4_4_ = -(uint)bVar48;
      bVar49 = fVar203 * fVar203 <=
               auVar75._8_4_ * auVar75._8_4_ * (fVar246 * fVar246 + fVar227 * fVar227) &&
               2.0 < fVar106;
      auVar147._8_4_ = -(uint)bVar49;
      bVar50 = fVar204 * fVar204 <=
               auVar75._12_4_ * auVar75._12_4_ *
               ((float)aVar272 * (float)aVar272 + fVar237 * fVar237) && 3.0 < fVar106;
      auVar147._12_4_ = -(uint)bVar50;
      local_308 = auVar235._0_4_;
      fStack_304 = auVar235._4_4_;
      fStack_300 = auVar235._8_4_;
      fStack_2fc = auVar235._12_4_;
      local_308 = local_308 * 4.7683716e-07;
      iVar53 = movmskps(iVar19,auVar147);
      fVar196 = fStack_3a0;
      fVar197 = fStack_3a0;
      fVar203 = fStack_3a0;
      fVar204 = fStack_380;
      fVar212 = fStack_380;
      fVar218 = fStack_380;
      if (iVar53 == 0) {
        bVar63 = false;
        local_3a8 = local_378;
        fStack_3a4 = fVar190;
        local_388 = local_3c8;
        fStack_384 = fVar73;
      }
      else {
        fVar128 = fVar136 * fStack_380 + local_2c8 * fStack_3a0 + fVar127 * fVar189 +
                  fVar157 * fVar167;
        fVar135 = fVar107 * fStack_380 + fStack_2c4 * fStack_3a0 + fVar134 * fVar189 +
                  fVar166 * fVar167;
        fVar137 = fVar108 * fStack_380 + fStack_2c0 * fStack_3a0 + fVar152 * fVar189 +
                  fVar191 * fVar167;
        fVar138 = fVar126 * fStack_380 + (float)aStack_2bc * fStack_3a0 + fVar154 * fVar189 +
                  fVar195 * fVar167;
        local_358._0_4_ = auVar29._0_4_;
        local_358._4_4_ = auVar29._4_4_;
        fStack_350 = auVar29._8_4_;
        fVar136 = (float)local_358._0_4_ * fVar189;
        fVar107 = (float)local_358._4_4_ * fVar189;
        fVar108 = fStack_350 * fVar189;
        local_3b8 = auVar28._0_4_;
        auStack_3b4._0_4_ = auVar28._4_4_;
        auStack_3b4._4_4_ = auVar28._8_4_;
        _local_358 = auVar147;
        local_3e8._0_4_ = auVar27._0_4_;
        local_3e8._4_4_ = auVar27._4_4_;
        fStack_3e0 = auVar27._8_4_;
        fVar140 = (float)local_3e8._0_4_ * fStack_380 + (float)local_3b8 * fStack_3a0 + fVar136 +
                  local_368 * fVar167;
        fVar153 = (float)local_3e8._4_4_ * fStack_380 + (float)auStack_3b4._0_4_ * fStack_3a0 +
                  fVar107 + fStack_364 * fVar167;
        fVar155 = fStack_3e0 * fStack_380 + (float)auStack_3b4._4_4_ * fStack_3a0 + fVar108 +
                  fStack_360 * fVar167;
        fVar156 = fVar125 * fStack_380 + fVar139 * fStack_3a0 + fVar165 * fVar189 +
                  fStack_35c * fVar167;
        local_2c8 = fVar240;
        fStack_2c4 = fVar243;
        fStack_2c0 = fVar246;
        aStack_2bc = aVar272;
        fVar136 = *(float *)(bezier_basis0 + lVar24 + 0x1210);
        fVar107 = *(float *)(bezier_basis0 + lVar24 + 0x1214);
        fVar108 = *(float *)(bezier_basis0 + lVar24 + 0x1218);
        fVar125 = *(float *)(bezier_basis0 + lVar24 + 0x121c);
        fVar126 = *(float *)(bezier_basis0 + lVar24 + 0x1694);
        fVar127 = *(float *)(bezier_basis0 + lVar24 + 0x1698);
        fVar134 = *(float *)(bezier_basis0 + lVar24 + 0x169c);
        fVar139 = *(float *)(bezier_basis0 + lVar24 + 0x16a0);
        fVar152 = *(float *)(bezier_basis0 + lVar24 + 0x1b18);
        fVar154 = *(float *)(bezier_basis0 + lVar24 + 0x1b1c);
        fVar157 = *(float *)(bezier_basis0 + lVar24 + 0x1b20);
        fVar165 = *(float *)(bezier_basis0 + lVar24 + 0x1b24);
        _local_3b8 = auVar217;
        local_3a8 = fStack_3a0;
        fStack_3a4 = fStack_3a0;
        fStack_39c = fStack_3a0;
        fVar166 = *(float *)(bezier_basis0 + lVar24 + 0x1f9c);
        fVar191 = *(float *)(bezier_basis0 + lVar24 + 0x1fa0);
        fVar195 = *(float *)(bezier_basis0 + lVar24 + 0x1fa4);
        fVar256 = *(float *)(bezier_basis0 + lVar24 + 0x1fa8);
        local_388 = fStack_380;
        fStack_384 = fStack_380;
        fStack_37c = fStack_380;
        _local_3e8 = auVar184;
        fVar228 = local_1e8 * fVar136 +
                  local_1f8 * fVar126 + local_378 * fVar152 + local_3c8 * fVar166;
        fVar238 = local_1e8 * fVar107 +
                  local_1f8 * fVar127 + local_378 * fVar154 + local_3c8 * fVar191;
        fVar241 = local_1e8 * fVar108 +
                  local_1f8 * fVar134 + local_378 * fVar157 + local_3c8 * fVar195;
        fVar244 = local_1e8 * fVar125 +
                  local_1f8 * fVar139 + local_378 * fVar165 + local_3c8 * fVar256;
        fVar280 = local_198 * fVar136 + local_2a8 * fVar126 + fVar190 * fVar152 + fVar73 * fVar166;
        fVar281 = local_198 * fVar107 + local_2a8 * fVar127 + fVar190 * fVar154 + fVar73 * fVar191;
        fVar282 = local_198 * fVar108 + local_2a8 * fVar134 + fVar190 * fVar157 + fVar73 * fVar195;
        fVar283 = local_198 * fVar125 + local_2a8 * fVar139 + fVar190 * fVar165 + fVar73 * fVar256;
        fVar258 = *(float *)(bezier_basis1 + lVar24 + 0x1210);
        fVar260 = *(float *)(bezier_basis1 + lVar24 + 0x1214);
        fVar263 = *(float *)(bezier_basis1 + lVar24 + 0x1218);
        fVar268 = *(float *)(bezier_basis1 + lVar24 + 0x121c);
        fVar269 = *(float *)(bezier_basis1 + lVar24 + 0x1b18);
        fVar271 = *(float *)(bezier_basis1 + lVar24 + 0x1b1c);
        fVar205 = *(float *)(bezier_basis1 + lVar24 + 0x1b20);
        fVar206 = *(float *)(bezier_basis1 + lVar24 + 0x1b24);
        fVar239 = *(float *)(bezier_basis1 + lVar24 + 0x1f9c);
        fVar242 = *(float *)(bezier_basis1 + lVar24 + 0x1fa0);
        fVar245 = *(float *)(bezier_basis1 + lVar24 + 0x1fa4);
        fVar247 = *(float *)(bezier_basis1 + lVar24 + 0x1fa8);
        fVar257 = *(float *)(bezier_basis1 + lVar24 + 0x1694);
        fVar259 = *(float *)(bezier_basis1 + lVar24 + 0x1698);
        fVar261 = *(float *)(bezier_basis1 + lVar24 + 0x169c);
        fVar270 = *(float *)(bezier_basis1 + lVar24 + 0x16a0);
        auVar121._0_4_ = fVar269 * fStack_3a0 + fVar239 * fStack_380;
        auVar121._4_4_ = fVar271 * fStack_3a0 + fVar242 * fStack_380;
        auVar121._8_4_ = fVar205 * fStack_3a0 + fVar245 * fStack_380;
        auVar121._12_4_ = fVar206 * fStack_3a0 + fVar247 * fStack_380;
        fVar273 = local_1e8 * fVar258 +
                  local_1f8 * fVar257 + local_378 * fVar269 + local_3c8 * fVar239;
        fVar277 = local_1e8 * fVar260 +
                  local_1f8 * fVar259 + local_378 * fVar271 + local_3c8 * fVar242;
        fVar278 = local_1e8 * fVar263 +
                  local_1f8 * fVar261 + local_378 * fVar205 + local_3c8 * fVar245;
        fVar279 = local_1e8 * fVar268 +
                  local_1f8 * fVar270 + local_378 * fVar206 + local_3c8 * fVar247;
        fVar269 = local_198 * fVar258 + local_2a8 * fVar257 + fVar190 * fVar269 + fVar73 * fVar239;
        fVar271 = local_198 * fVar260 + local_2a8 * fVar259 + fVar190 * fVar271 + fVar73 * fVar242;
        fVar205 = local_198 * fVar263 + local_2a8 * fVar261 + fVar190 * fVar205 + fVar73 * fVar245;
        fVar206 = local_198 * fVar268 + local_2a8 * fVar270 + fVar190 * fVar206 + fVar73 * fVar247;
        auVar253._0_8_ = CONCAT44(fVar238,fVar228) & 0x7fffffff7fffffff;
        auVar253._8_4_ = ABS(fVar241);
        auVar253._12_4_ = ABS(fVar244);
        auVar97._0_8_ = CONCAT44(fVar281,fVar280) & 0x7fffffff7fffffff;
        auVar97._8_4_ = ABS(fVar282);
        auVar97._12_4_ = ABS(fVar283);
        auVar75 = maxps(auVar253,auVar97);
        auVar264._0_8_ =
             CONCAT44(fVar107 * fVar167 +
                      fVar127 * fVar189 + fVar154 * fStack_3a0 + fVar191 * fStack_380,
                      fVar136 * fVar167 +
                      fVar126 * fVar189 + fVar152 * fStack_3a0 + fVar166 * fStack_380) &
             0x7fffffff7fffffff;
        auVar264._8_4_ =
             ABS(fVar108 * fVar167 + fVar134 * fVar189 + fVar157 * fStack_3a0 + fVar195 * fStack_380
                );
        auVar264._12_4_ =
             ABS(fVar125 * fVar167 + fVar139 * fVar189 + fVar165 * fStack_3a0 + fVar256 * fStack_380
                );
        auVar75 = maxps(auVar75,auVar264);
        uVar67 = -(uint)(local_308 <= auVar75._0_4_);
        uVar68 = -(uint)(local_308 <= auVar75._4_4_);
        uVar69 = -(uint)(local_308 <= auVar75._8_4_);
        uVar70 = -(uint)(local_308 <= auVar75._12_4_);
        fVar126 = (float)((uint)fVar228 & uVar67 | ~uVar67 & (uint)fVar240);
        fVar127 = (float)((uint)fVar238 & uVar68 | ~uVar68 & (uint)fVar243);
        fVar134 = (float)((uint)fVar241 & uVar69 | ~uVar69 & (uint)fVar246);
        fVar139 = (float)((uint)fVar244 & uVar70 | ~uVar70 & (uint)aVar272);
        fVar152 = (float)(~uVar67 & (uint)fVar211 | (uint)fVar280 & uVar67);
        fVar154 = (float)(~uVar68 & (uint)fVar225 | (uint)fVar281 & uVar68);
        fVar157 = (float)(~uVar69 & (uint)fVar227 | (uint)fVar282 & uVar69);
        fVar165 = (float)(~uVar70 & (uint)fVar237 | (uint)fVar283 & uVar70);
        auVar265._0_8_ = CONCAT44(fVar277,fVar273) & 0x7fffffff7fffffff;
        auVar265._8_4_ = ABS(fVar278);
        auVar265._12_4_ = ABS(fVar279);
        auVar209._0_8_ = CONCAT44(fVar271,fVar269) & 0x7fffffff7fffffff;
        auVar209._8_4_ = ABS(fVar205);
        auVar209._12_4_ = ABS(fVar206);
        auVar75 = maxps(auVar265,auVar209);
        auVar193._0_8_ =
             CONCAT44(fVar260 * fVar167 + fVar259 * fVar189 + auVar121._4_4_,
                      fVar258 * fVar167 + fVar257 * fVar189 + auVar121._0_4_) & 0x7fffffff7fffffff;
        auVar193._8_4_ = ABS(fVar263 * fVar167 + fVar261 * fVar189 + auVar121._8_4_);
        auVar193._12_4_ = ABS(fVar268 * fVar167 + fVar270 * fVar189 + auVar121._12_4_);
        auVar75 = maxps(auVar75,auVar193);
        uVar67 = -(uint)(local_308 <= auVar75._0_4_);
        uVar68 = -(uint)(local_308 <= auVar75._4_4_);
        uVar69 = -(uint)(local_308 <= auVar75._8_4_);
        uVar70 = -(uint)(local_308 <= auVar75._12_4_);
        fVar256 = (float)((uint)fVar273 & uVar67 | ~uVar67 & (uint)fVar240);
        fVar243 = (float)((uint)fVar277 & uVar68 | ~uVar68 & (uint)fVar243);
        fVar246 = (float)((uint)fVar278 & uVar69 | ~uVar69 & (uint)fVar246);
        fVar258 = (float)((uint)fVar279 & uVar70 | ~uVar70 & (uint)aVar272);
        fVar240 = (float)(~uVar67 & (uint)fVar211 | (uint)fVar269 & uVar67);
        fVar225 = (float)(~uVar68 & (uint)fVar225 | (uint)fVar271 & uVar68);
        fVar227 = (float)(~uVar69 & (uint)fVar227 | (uint)fVar205 & uVar69);
        fVar237 = (float)(~uVar70 & (uint)fVar237 | (uint)fVar206 & uVar70);
        auVar98._0_4_ = fVar152 * fVar152 + fVar126 * fVar126;
        auVar98._4_4_ = fVar154 * fVar154 + fVar127 * fVar127;
        auVar98._8_4_ = fVar157 * fVar157 + fVar134 * fVar134;
        auVar98._12_4_ = fVar165 * fVar165 + fVar139 * fVar139;
        auVar75 = rsqrtps(auVar121,auVar98);
        fVar136 = auVar75._0_4_;
        fVar107 = auVar75._4_4_;
        fVar108 = auVar75._8_4_;
        fVar125 = auVar75._12_4_;
        auVar122._0_4_ = fVar136 * fVar136 * auVar98._0_4_ * 0.5 * fVar136;
        auVar122._4_4_ = fVar107 * fVar107 * auVar98._4_4_ * 0.5 * fVar107;
        auVar122._8_4_ = fVar108 * fVar108 * auVar98._8_4_ * 0.5 * fVar108;
        auVar122._12_4_ = fVar125 * fVar125 * auVar98._12_4_ * 0.5 * fVar125;
        fVar260 = fVar136 * 1.5 - auVar122._0_4_;
        fVar263 = fVar107 * 1.5 - auVar122._4_4_;
        fVar268 = fVar108 * 1.5 - auVar122._8_4_;
        fVar269 = fVar125 * 1.5 - auVar122._12_4_;
        auVar99._0_4_ = fVar240 * fVar240 + fVar256 * fVar256;
        auVar99._4_4_ = fVar225 * fVar225 + fVar243 * fVar243;
        auVar99._8_4_ = fVar227 * fVar227 + fVar246 * fVar246;
        auVar99._12_4_ = fVar237 * fVar237 + fVar258 * fVar258;
        auVar75 = rsqrtps(auVar122,auVar99);
        fVar136 = auVar75._0_4_;
        fVar107 = auVar75._4_4_;
        fVar108 = auVar75._8_4_;
        fVar125 = auVar75._12_4_;
        fVar136 = fVar136 * 1.5 - fVar136 * fVar136 * auVar99._0_4_ * 0.5 * fVar136;
        fVar107 = fVar107 * 1.5 - fVar107 * fVar107 * auVar99._4_4_ * 0.5 * fVar107;
        fVar108 = fVar108 * 1.5 - fVar108 * fVar108 * auVar99._8_4_ * 0.5 * fVar108;
        fVar125 = fVar125 * 1.5 - fVar125 * fVar125 * auVar99._12_4_ * 0.5 * fVar125;
        fVar166 = fVar152 * fVar260 * fVar220;
        fVar191 = fVar154 * fVar263 * fVar226;
        fVar195 = fVar157 * fVar268 * auVar184._8_4_;
        fVar211 = fVar165 * fVar269 * auVar184._12_4_;
        fVar126 = -fVar126 * fVar260 * fVar220;
        fVar127 = -fVar127 * fVar263 * fVar226;
        fVar134 = -fVar134 * fVar268 * auVar184._8_4_;
        fVar139 = -fVar139 * fVar269 * auVar184._12_4_;
        fVar238 = fVar260 * 0.0 * fVar220;
        fVar241 = fVar263 * 0.0 * fVar226;
        fVar244 = fVar268 * 0.0 * auVar184._8_4_;
        fVar273 = fVar269 * 0.0 * auVar184._12_4_;
        local_368 = fVar140 + fVar238;
        fStack_364 = fVar153 + fVar241;
        fStack_360 = fVar155 + fVar244;
        fStack_35c = fVar156 + fVar273;
        fVar260 = fVar240 * fVar136 * auVar217._0_4_;
        fVar263 = fVar225 * fVar107 * auVar217._4_4_;
        fVar270 = fVar227 * fVar108 * auVar217._8_4_;
        fVar228 = fVar237 * fVar125 * auVar217._12_4_;
        fVar268 = (float)local_218._0_4_ + fVar260;
        fVar269 = (float)local_218._4_4_ + fVar263;
        fVar271 = fStack_210 + fVar270;
        fVar205 = fStack_20c + fVar228;
        fVar227 = -fVar256 * fVar136 * auVar217._0_4_;
        fVar240 = -fVar243 * fVar107 * auVar217._4_4_;
        fVar246 = -fVar246 * fVar108 * auVar217._8_4_;
        fVar258 = -fVar258 * fVar125 * auVar217._12_4_;
        fVar206 = fVar219 + fVar227;
        fVar239 = fVar262 + fVar240;
        fVar242 = fVar207 + fVar246;
        fVar245 = fVar210 + fVar258;
        fVar152 = fVar136 * 0.0 * auVar217._0_4_;
        fVar154 = fVar107 * 0.0 * auVar217._4_4_;
        fVar157 = fVar108 * 0.0 * auVar217._8_4_;
        fVar165 = fVar125 * 0.0 * auVar217._12_4_;
        fVar225 = local_1a8 - fVar166;
        fVar237 = fStack_1a4 - fVar191;
        fVar243 = fStack_1a0 - fVar195;
        fVar256 = fStack_19c - fVar211;
        fVar247 = fVar128 + fVar152;
        fVar257 = fVar135 + fVar154;
        fVar259 = fVar137 + fVar157;
        fVar261 = fVar138 + fVar165;
        fVar136 = local_1b8 - fVar126;
        fVar107 = fStack_1b4 - fVar127;
        fVar108 = fStack_1b0 - fVar134;
        fVar125 = fStack_1ac - fVar139;
        fVar140 = fVar140 - fVar238;
        fVar153 = fVar153 - fVar241;
        fVar155 = fVar155 - fVar244;
        fVar156 = fVar156 - fVar273;
        uVar67 = -(uint)(0.0 < (fVar136 * (fVar247 - fVar140) - fVar140 * (fVar206 - fVar136)) * 0.0
                               + (fVar140 * (fVar268 - fVar225) - (fVar247 - fVar140) * fVar225) *
                                 0.0 + ((fVar206 - fVar136) * fVar225 -
                                       (fVar268 - fVar225) * fVar136));
        uVar68 = -(uint)(0.0 < (fVar107 * (fVar257 - fVar153) - fVar153 * (fVar239 - fVar107)) * 0.0
                               + (fVar153 * (fVar269 - fVar237) - (fVar257 - fVar153) * fVar237) *
                                 0.0 + ((fVar239 - fVar107) * fVar237 -
                                       (fVar269 - fVar237) * fVar107));
        uVar69 = -(uint)(0.0 < (fVar108 * (fVar259 - fVar155) - fVar155 * (fVar242 - fVar108)) * 0.0
                               + (fVar155 * (fVar271 - fVar243) - (fVar259 - fVar155) * fVar243) *
                                 0.0 + ((fVar242 - fVar108) * fVar243 -
                                       (fVar271 - fVar243) * fVar108));
        uVar70 = -(uint)(0.0 < (fVar125 * (fVar261 - fVar156) - fVar156 * (fVar245 - fVar125)) * 0.0
                               + (fVar156 * (fVar205 - fVar256) - (fVar261 - fVar156) * fVar256) *
                                 0.0 + ((fVar245 - fVar125) * fVar256 -
                                       (fVar205 - fVar256) * fVar125));
        fVar166 = (float)((uint)((float)local_218._0_4_ - fVar260) & uVar67 |
                         ~uVar67 & (uint)(local_1a8 + fVar166));
        fVar191 = (float)((uint)((float)local_218._4_4_ - fVar263) & uVar68 |
                         ~uVar68 & (uint)(fStack_1a4 + fVar191));
        fVar195 = (float)((uint)(fStack_210 - fVar270) & uVar69 |
                         ~uVar69 & (uint)(fStack_1a0 + fVar195));
        fVar211 = (float)((uint)(fStack_20c - fVar228) & uVar70 |
                         ~uVar70 & (uint)(fStack_19c + fVar211));
        fVar260 = (float)((uint)(fVar219 - fVar227) & uVar67 | ~uVar67 & (uint)(local_1b8 + fVar126)
                         );
        fVar263 = (float)((uint)(fVar262 - fVar240) & uVar68 |
                         ~uVar68 & (uint)(fStack_1b4 + fVar127));
        fStack_3d0 = (float)((uint)(fVar207 - fVar246) & uVar69 |
                            ~uVar69 & (uint)(fStack_1b0 + fVar134));
        fStack_3cc = (float)((uint)(fVar210 - fVar258) & uVar70 |
                            ~uVar70 & (uint)(fStack_1ac + fVar139));
        fVar270 = (float)((uint)(fVar128 - fVar152) & uVar67 | ~uVar67 & (uint)local_368);
        fVar128 = (float)((uint)(fVar135 - fVar154) & uVar68 | ~uVar68 & (uint)fStack_364);
        fVar135 = (float)((uint)(fVar137 - fVar157) & uVar69 | ~uVar69 & (uint)fStack_360);
        fVar137 = (float)((uint)(fVar138 - fVar165) & uVar70 | ~uVar70 & (uint)fStack_35c);
        fVar227 = (float)((uint)fVar225 & uVar67 | ~uVar67 & (uint)fVar268);
        fVar240 = (float)((uint)fVar237 & uVar68 | ~uVar68 & (uint)fVar269);
        fVar246 = (float)((uint)fVar243 & uVar69 | ~uVar69 & (uint)fVar271);
        fVar258 = (float)((uint)fVar256 & uVar70 | ~uVar70 & (uint)fVar205);
        fVar126 = (float)((uint)fVar136 & uVar67 | ~uVar67 & (uint)fVar206);
        fVar127 = (float)((uint)fVar107 & uVar68 | ~uVar68 & (uint)fVar239);
        fVar134 = (float)((uint)fVar108 & uVar69 | ~uVar69 & (uint)fVar242);
        fVar139 = (float)((uint)fVar125 & uVar70 | ~uVar70 & (uint)fVar245);
        fVar152 = (float)((uint)fVar140 & uVar67 | ~uVar67 & (uint)fVar247);
        fVar154 = (float)((uint)fVar153 & uVar68 | ~uVar68 & (uint)fVar257);
        fVar157 = (float)((uint)fVar155 & uVar69 | ~uVar69 & (uint)fVar259);
        fVar165 = (float)((uint)fVar156 & uVar70 | ~uVar70 & (uint)fVar261);
        fVar225 = (float)((uint)fVar268 & uVar67 | ~uVar67 & (uint)fVar225) - fVar166;
        fVar237 = (float)((uint)fVar269 & uVar68 | ~uVar68 & (uint)fVar237) - fVar191;
        fVar243 = (float)((uint)fVar271 & uVar69 | ~uVar69 & (uint)fVar243) - fVar195;
        fVar256 = (float)((uint)fVar205 & uVar70 | ~uVar70 & (uint)fVar256) - fVar211;
        fVar268 = (float)((uint)fVar206 & uVar67 | ~uVar67 & (uint)fVar136) - fVar260;
        fVar269 = (float)((uint)fVar239 & uVar68 | ~uVar68 & (uint)fVar107) - fVar263;
        fVar271 = (float)((uint)fVar242 & uVar69 | ~uVar69 & (uint)fVar108) - fStack_3d0;
        fVar205 = (float)((uint)fVar245 & uVar70 | ~uVar70 & (uint)fVar125) - fStack_3cc;
        fVar206 = (float)((uint)fVar247 & uVar67 | ~uVar67 & (uint)fVar140) - fVar270;
        fVar239 = (float)((uint)fVar257 & uVar68 | ~uVar68 & (uint)fVar153) - fVar128;
        fVar242 = (float)((uint)fVar259 & uVar69 | ~uVar69 & (uint)fVar155) - fVar135;
        fVar245 = (float)((uint)fVar261 & uVar70 | ~uVar70 & (uint)fVar156) - fVar137;
        fVar138 = fVar166 - fVar227;
        fVar140 = fVar191 - fVar240;
        fVar153 = fVar195 - fVar246;
        fVar155 = fVar211 - fVar258;
        fVar219 = fVar260 - fVar126;
        fVar262 = fVar263 - fVar127;
        fVar207 = fStack_3d0 - fVar134;
        fVar210 = fStack_3cc - fVar139;
        local_3d8 = CONCAT44(fVar263,fVar260);
        fVar136 = fVar270 - fVar152;
        fVar107 = fVar128 - fVar154;
        fVar108 = fVar135 - fVar157;
        fVar125 = fVar137 - fVar165;
        fVar247 = (fVar260 * fVar206 - fVar270 * fVar268) * 0.0 +
                  (fVar270 * fVar225 - fVar166 * fVar206) * 0.0 +
                  (fVar166 * fVar268 - fVar260 * fVar225);
        fVar257 = (fVar263 * fVar239 - fVar128 * fVar269) * 0.0 +
                  (fVar128 * fVar237 - fVar191 * fVar239) * 0.0 +
                  (fVar191 * fVar269 - fVar263 * fVar237);
        auVar148._4_4_ = fVar257;
        auVar148._0_4_ = fVar247;
        fVar259 = (fStack_3d0 * fVar242 - fVar135 * fVar271) * 0.0 +
                  (fVar135 * fVar243 - fVar195 * fVar242) * 0.0 +
                  (fVar195 * fVar271 - fStack_3d0 * fVar243);
        fVar261 = (fStack_3cc * fVar245 - fVar137 * fVar205) * 0.0 +
                  (fVar137 * fVar256 - fVar211 * fVar245) * 0.0 +
                  (fVar211 * fVar205 - fStack_3cc * fVar256);
        auVar274._0_4_ =
             (fVar126 * fVar136 - fVar152 * fVar219) * 0.0 +
             (fVar152 * fVar138 - fVar227 * fVar136) * 0.0 + (fVar227 * fVar219 - fVar126 * fVar138)
        ;
        auVar274._4_4_ =
             (fVar127 * fVar107 - fVar154 * fVar262) * 0.0 +
             (fVar154 * fVar140 - fVar240 * fVar107) * 0.0 + (fVar240 * fVar262 - fVar127 * fVar140)
        ;
        auVar274._8_4_ =
             (fVar134 * fVar108 - fVar157 * fVar207) * 0.0 +
             (fVar157 * fVar153 - fVar246 * fVar108) * 0.0 + (fVar246 * fVar207 - fVar134 * fVar153)
        ;
        auVar274._12_4_ =
             (fVar139 * fVar125 - fVar165 * fVar210) * 0.0 +
             (fVar165 * fVar155 - fVar258 * fVar125) * 0.0 + (fVar258 * fVar210 - fVar139 * fVar155)
        ;
        auVar148._8_4_ = fVar259;
        auVar148._12_4_ = fVar261;
        auVar75 = maxps(auVar148,auVar274);
        bVar63 = auVar75._0_4_ <= 0.0 && bVar63;
        auVar149._0_4_ = -(uint)bVar63;
        bVar48 = auVar75._4_4_ <= 0.0 && bVar48;
        auVar149._4_4_ = -(uint)bVar48;
        bVar49 = auVar75._8_4_ <= 0.0 && bVar49;
        auVar149._8_4_ = -(uint)bVar49;
        bVar50 = auVar75._12_4_ <= 0.0 && bVar50;
        auVar149._12_4_ = -(uint)bVar50;
        iVar53 = movmskps(iVar53,auVar149);
        if (iVar53 == 0) {
LAB_00b27c79:
          iVar53 = 0;
          auVar101._8_8_ = uStack_310;
          auVar101._0_8_ = local_318;
        }
        else {
          fVar126 = local_390->tfar;
          auVar100._0_4_ = fVar136 * fVar268;
          auVar100._4_4_ = fVar107 * fVar269;
          auVar100._8_4_ = fVar108 * fVar271;
          auVar100._12_4_ = fVar125 * fVar205;
          fVar154 = fVar219 * fVar206 - auVar100._0_4_;
          fVar157 = fVar262 * fVar239 - auVar100._4_4_;
          fVar165 = fVar207 * fVar242 - auVar100._8_4_;
          fVar227 = fVar210 * fVar245 - auVar100._12_4_;
          fVar127 = fVar136 * fVar225 - fVar206 * fVar138;
          fVar134 = fVar107 * fVar237 - fVar239 * fVar140;
          fVar139 = fVar108 * fVar243 - fVar242 * fVar153;
          fVar152 = fVar125 * fVar256 - fVar245 * fVar155;
          fVar219 = fVar138 * fVar268 - fVar219 * fVar225;
          fVar262 = fVar140 * fVar269 - fVar262 * fVar237;
          fVar207 = fVar153 * fVar271 - fVar207 * fVar243;
          fVar210 = fVar155 * fVar205 - fVar210 * fVar256;
          auVar185._0_4_ = fVar154 * 0.0 + fVar127 * 0.0 + fVar219;
          auVar185._4_4_ = fVar157 * 0.0 + fVar134 * 0.0 + fVar262;
          auVar185._8_4_ = fVar165 * 0.0 + fVar139 * 0.0 + fVar207;
          auVar185._12_4_ = fVar227 * 0.0 + fVar152 * 0.0 + fVar210;
          auVar75 = rcpps(auVar100,auVar185);
          fVar136 = auVar75._0_4_;
          fVar107 = auVar75._4_4_;
          fVar108 = auVar75._8_4_;
          fVar125 = auVar75._12_4_;
          fVar136 = (1.0 - auVar185._0_4_ * fVar136) * fVar136 + fVar136;
          fVar107 = (1.0 - auVar185._4_4_ * fVar107) * fVar107 + fVar107;
          fVar108 = (1.0 - auVar185._8_4_ * fVar108) * fVar108 + fVar108;
          fVar125 = (1.0 - auVar185._12_4_ * fVar125) * fVar125 + fVar125;
          fVar127 = (fVar270 * fVar219 + fVar260 * fVar127 + fVar166 * fVar154) * fVar136;
          fVar134 = (fVar128 * fVar262 + fVar263 * fVar134 + fVar191 * fVar157) * fVar107;
          fVar139 = (fVar135 * fVar207 + fStack_3d0 * fVar139 + fVar195 * fVar165) * fVar108;
          fVar152 = (fVar137 * fVar210 + fStack_3cc * fVar152 + fVar211 * fVar227) * fVar125;
          bVar63 = (fVar127 <= fVar126 && fStack_1fc <= fVar127) && bVar63;
          auVar159._0_4_ = -(uint)bVar63;
          bVar48 = (fVar134 <= fVar126 && fStack_1fc <= fVar134) && bVar48;
          auVar159._4_4_ = -(uint)bVar48;
          bVar49 = (fVar139 <= fVar126 && fStack_1fc <= fVar139) && bVar49;
          auVar159._8_4_ = -(uint)bVar49;
          bVar50 = (fVar152 <= fVar126 && fStack_1fc <= fVar152) && bVar50;
          auVar159._12_4_ = -(uint)bVar50;
          iVar53 = movmskps(iVar53,auVar159);
          if (iVar53 == 0) goto LAB_00b27c79;
          auVar160._0_8_ =
               CONCAT44(-(uint)(auVar185._4_4_ != 0.0 && bVar48),
                        -(uint)(auVar185._0_4_ != 0.0 && bVar63));
          auVar160._8_4_ = -(uint)(auVar185._8_4_ != 0.0 && bVar49);
          auVar160._12_4_ = -(uint)(auVar185._12_4_ != 0.0 && bVar50);
          iVar53 = movmskps(iVar53,auVar160);
          auVar101._8_8_ = uStack_310;
          auVar101._0_8_ = local_318;
          if (iVar53 != 0) {
            fVar247 = fVar247 * fVar136;
            fVar257 = fVar257 * fVar107;
            fVar259 = fVar259 * fVar108;
            fVar261 = fVar261 * fVar125;
            local_338 = (float)((uint)(1.0 - fVar247) & uVar67 | ~uVar67 & (uint)fVar247);
            fStack_334 = (float)((uint)(1.0 - fVar257) & uVar68 | ~uVar68 & (uint)fVar257);
            fStack_330 = (float)((uint)(1.0 - fVar259) & uVar69 | ~uVar69 & (uint)fVar259);
            fStack_32c = (float)((uint)(1.0 - fVar261) & uVar70 | ~uVar70 & (uint)fVar261);
            auVar101._8_4_ = auVar160._8_4_;
            auVar101._0_8_ = auVar160._0_8_;
            auVar101._12_4_ = auVar160._12_4_;
            local_1c8 = (float)(~uVar67 & (uint)(auVar274._0_4_ * fVar136) |
                               (uint)(1.0 - auVar274._0_4_ * fVar136) & uVar67);
            fStack_1c4 = (float)(~uVar68 & (uint)(auVar274._4_4_ * fVar107) |
                                (uint)(1.0 - auVar274._4_4_ * fVar107) & uVar68);
            fStack_1c0 = (float)(~uVar69 & (uint)(auVar274._8_4_ * fVar108) |
                                (uint)(1.0 - auVar274._8_4_ * fVar108) & uVar69);
            fStack_1bc = (float)(~uVar70 & (uint)(auVar274._12_4_ * fVar125) |
                                (uint)(1.0 - auVar274._12_4_ * fVar125) & uVar70);
            local_348 = fVar127;
            fStack_344 = fVar134;
            fStack_340 = fVar139;
            fStack_33c = fVar152;
          }
        }
        iVar53 = movmskps(iVar53,auVar101);
        if (iVar53 == 0) {
          bVar63 = false;
        }
        else {
          fVar220 = (auVar217._0_4_ - fVar220) * local_338 + fVar220;
          fVar226 = (auVar217._4_4_ - fVar226) * fStack_334 + fVar226;
          fVar107 = (auVar217._8_4_ - auVar184._8_4_) * fStack_330 + auVar184._8_4_;
          fVar108 = (auVar217._12_4_ - auVar184._12_4_) * fStack_32c + auVar184._12_4_;
          fVar136 = local_320->depth_scale;
          auVar123._0_4_ = -(uint)(fVar136 * (fVar220 + fVar220) < local_348) & auVar101._0_4_;
          auVar123._4_4_ = -(uint)(fVar136 * (fVar226 + fVar226) < fStack_344) & auVar101._4_4_;
          auVar123._8_4_ = -(uint)(fVar136 * (fVar107 + fVar107) < fStack_340) & auVar101._8_4_;
          auVar123._12_4_ = -(uint)(fVar136 * (fVar108 + fVar108) < fStack_33c) & auVar101._12_4_;
          uVar67 = movmskps((int)local_320,auVar123);
          if (uVar67 != 0) {
            local_1c8 = local_1c8 + local_1c8 + -1.0;
            fStack_1c4 = fStack_1c4 + fStack_1c4 + -1.0;
            fStack_1c0 = fStack_1c0 + fStack_1c0 + -1.0;
            fStack_1bc = fStack_1bc + fStack_1bc + -1.0;
            local_158 = local_338;
            fStack_154 = fStack_334;
            fStack_150 = fStack_330;
            fStack_14c = fStack_32c;
            local_148 = local_1c8;
            fStack_144 = fStack_1c4;
            fStack_140 = fStack_1c0;
            fStack_13c = fStack_1bc;
            local_138 = local_348;
            fStack_134 = fStack_344;
            fStack_130 = fStack_340;
            fStack_12c = fStack_33c;
            local_128 = 0;
            local_124 = iVar19;
            local_118 = CONCAT44(fStack_2b4,local_2b8);
            uStack_110 = CONCAT44(fStack_2ac,fStack_2b0);
            local_108 = CONCAT44(fStack_234,local_238);
            uStack_100 = CONCAT44(fStack_22c,fStack_230);
            local_f8 = CONCAT44(fStack_244,local_248);
            uStack_f0 = CONCAT44(fStack_23c,fStack_240);
            local_e8 = CONCAT44(fStack_224,local_228);
            uStack_e0 = CONCAT44(fStack_21c,fStack_220);
            local_d8 = auVar123;
            pRVar59 = (RTCIntersectArguments *)(ulong)(uint)local_390->mask;
            if ((pGVar20->mask & local_390->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar63 = true, pRVar59 = context->args,
                 pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar106 = 1.0 / fVar106;
                local_c8[0] = fVar106 * (local_338 + 0.0);
                local_c8[1] = fVar106 * (fStack_334 + 1.0);
                local_c8[2] = fVar106 * (fStack_330 + 2.0);
                local_c8[3] = fVar106 * (fStack_32c + 3.0);
                local_b8 = CONCAT44(fStack_1c4,local_1c8);
                uStack_b0 = CONCAT44(fStack_1bc,fStack_1c0);
                local_a8[0] = local_348;
                local_a8[1] = fStack_344;
                local_a8[2] = fStack_340;
                local_a8[3] = fStack_33c;
                uVar56 = (ulong)(uVar67 & 0xff);
                pRVar59 = (RTCIntersectArguments *)0x0;
                if (uVar56 != 0) {
                  for (; ((uVar67 & 0xff) >> (long)pRVar59 & 1) == 0;
                      pRVar59 = (RTCIntersectArguments *)((long)&pRVar59->flags + 1)) {
                  }
                }
                local_3d8 = CONCAT44(fVar263,local_390->tfar);
                do {
                  local_28c = local_c8[(long)pRVar59];
                  local_288 = *(undefined4 *)((long)&local_b8 + (long)pRVar59 * 4);
                  local_390->tfar = local_a8[(long)pRVar59];
                  local_2f8._16_8_ = context->user;
                  fVar136 = 1.0 - local_28c;
                  fVar107 = local_28c * fVar136 + local_28c * fVar136;
                  fVar106 = fVar136 * fVar136 * -3.0;
                  fVar108 = (fVar136 * fVar136 - fVar107) * 3.0;
                  fVar136 = (fVar107 - local_28c * local_28c) * 3.0;
                  fVar107 = local_28c * local_28c * 3.0;
                  local_298 = CONCAT44(fVar106 * fStack_2b4 +
                                       fVar108 * fStack_234 +
                                       fVar136 * fStack_244 + fVar107 * fStack_224,
                                       fVar106 * local_2b8 +
                                       fVar108 * local_238 +
                                       fVar136 * local_248 + fVar107 * local_228);
                  local_290 = fVar106 * fStack_2b0 +
                              fVar108 * fStack_230 + fVar136 * fStack_240 + fVar107 * fStack_220;
                  local_284 = (int)local_260;
                  local_280 = (int)local_328;
                  local_27c = *(uint *)&(((Device *)local_2f8._16_8_)->super_State).super_RefCount.
                                        _vptr_RefCount;
                  local_278 = *(uint *)((long)&(((Device *)local_2f8._16_8_)->super_State).
                                               super_RefCount._vptr_RefCount + 4);
                  local_40c = -1;
                  local_2f8._0_8_ = &local_40c;
                  local_2f8._8_8_ = pGVar20->userPtr;
                  local_2f8._24_8_ = local_390;
                  local_2f8._32_8_ = &local_298;
                  local_2d0 = 1.4013e-45;
                  if (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b26cf2:
                    pRVar60 = context->args;
                    if ((pRVar60->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar60->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar64 = (undefined1  [8])local_2f8;
                      (*pRVar60->filter)((RTCFilterFunctionNArguments *)auVar64);
                      if (*(int *)local_2f8._0_8_ == 0) goto LAB_00b26d33;
                    }
                    bVar63 = true;
                    pRVar59 = pRVar60;
                    fVar196 = local_3a8;
                    fVar197 = fStack_3a4;
                    fVar203 = fStack_39c;
                    fVar204 = local_388;
                    fVar212 = fStack_384;
                    fVar218 = fStack_37c;
                    break;
                  }
                  auVar64 = (undefined1  [8])local_2f8;
                  (*pGVar20->occlusionFilterN)((RTCFilterFunctionNArguments *)auVar64);
                  if (*(int *)local_2f8._0_8_ != 0) goto LAB_00b26cf2;
LAB_00b26d33:
                  local_390->tfar = (float)local_3d8;
                  uVar56 = uVar56 ^ 1L << ((ulong)pRVar59 & 0x3f);
                  pRVar59 = (RTCIntersectArguments *)0x0;
                  if (uVar56 != 0) {
                    for (; (uVar56 >> (long)pRVar59 & 1) == 0;
                        pRVar59 = (RTCIntersectArguments *)((long)&pRVar59->flags + 1)) {
                    }
                  }
                  bVar63 = false;
                  fVar196 = local_3a8;
                  fVar197 = fStack_3a4;
                  fVar203 = fStack_39c;
                  fVar204 = local_388;
                  fVar212 = fStack_384;
                  fVar218 = fStack_37c;
                } while (uVar56 != 0);
              }
              goto LAB_00b26e11;
            }
          }
          bVar63 = false;
        }
      }
LAB_00b26e11:
      uVar57 = SUB84(pRVar59,0);
      ray = local_390;
      if (4 < iVar19) {
        local_388 = fVar204;
        fStack_384 = fVar212;
        fStack_37c = fVar218;
        local_3a8 = fVar196;
        fStack_3a4 = fVar197;
        fStack_39c = fVar203;
        local_88 = iVar19;
        iStack_84 = iVar19;
        iStack_80 = iVar19;
        iStack_7c = iVar19;
        local_208 = fStack_1fc;
        fStack_204 = fStack_1fc;
        fStack_200 = fStack_1fc;
        local_98 = 1.0 / (float)local_258._0_4_;
        fStack_94 = local_98;
        fStack_90 = local_98;
        fStack_8c = local_98;
        lVar65 = 4;
        fStack_304 = local_308;
        fStack_300 = local_308;
        fStack_2fc = local_308;
        do {
          uVar68 = (uint)lVar65;
          puVar61 = bezier_basis0 + lVar24;
          pauVar8 = (undefined1 (*) [16])(puVar61 + lVar65 * 4);
          fVar136 = *(float *)*pauVar8;
          fVar106 = *(float *)(*pauVar8 + 4);
          fVar107 = *(float *)(*pauVar8 + 8);
          auVar28 = *(undefined1 (*) [12])*pauVar8;
          fVar108 = *(float *)(*pauVar8 + 0xc);
          _local_358 = *pauVar8;
          pfVar1 = (float *)(lVar24 + 0x21aa768 + lVar65 * 4);
          local_368 = *pfVar1;
          fStack_364 = pfVar1[1];
          fStack_360 = pfVar1[2];
          fStack_35c = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21aabec + lVar65 * 4);
          local_2c8 = *pfVar1;
          fStack_2c4 = pfVar1[1];
          fStack_2c0 = pfVar1[2];
          aStack_2bc = *(anon_struct_4_6_abad0318_for_Geometry_10 *)(pfVar1 + 3);
          pauVar8 = (undefined1 (*) [16])(lVar24 + 0x21ab070 + lVar65 * 4);
          fVar125 = *(float *)*pauVar8;
          fVar126 = *(float *)(*pauVar8 + 4);
          fVar127 = *(float *)(*pauVar8 + 8);
          auVar27 = *(undefined1 (*) [12])*pauVar8;
          fVar134 = *(float *)(*pauVar8 + 0xc);
          _local_3e8 = *pauVar8;
          local_1b8 = local_1e8 * fVar136 +
                      local_1f8 * local_368 + local_378 * local_2c8 + local_3c8 * fVar125;
          fStack_1b4 = fStack_1e4 * fVar106 +
                       fStack_1f4 * fStack_364 + fStack_374 * fStack_2c4 + fStack_3c4 * fVar126;
          fStack_1b0 = fStack_1e0 * fVar107 +
                       fStack_1f0 * fStack_360 + fStack_370 * fStack_2c0 + fStack_3c0 * fVar127;
          fStack_1ac = fStack_1dc * fVar108 +
                       fStack_1ec * fStack_35c +
                       fStack_36c * (float)aStack_2bc + fStack_3bc * fVar134;
          local_1a8 = local_198 * fVar136 +
                      local_2a8 * local_368 + fVar190 * local_2c8 + fVar73 * fVar125;
          fStack_1a4 = fStack_194 * fVar106 +
                       fStack_2a4 * fStack_364 + fVar190 * fStack_2c4 + fVar73 * fVar126;
          fStack_1a0 = fStack_190 * fVar107 +
                       fStack_2a0 * fStack_360 + fVar190 * fStack_2c0 + fVar73 * fVar127;
          fStack_19c = fStack_18c * fVar108 +
                       fStack_29c * fStack_35c + fVar190 * (float)aStack_2bc + fVar73 * fVar134;
          local_3b8 = (undefined1  [4])
                      (local_188 * fVar136 +
                      local_178 * local_368 + local_168 * local_2c8 + local_58 * fVar125);
          auStack_3b4._0_4_ =
               fStack_184 * fVar106 +
               fStack_174 * fStack_364 + fStack_164 * fStack_2c4 + fStack_54 * fVar126;
          auStack_3b4._4_4_ =
               fStack_180 * fVar107 +
               fStack_170 * fStack_360 + fStack_160 * fStack_2c0 + fStack_50 * fVar127;
          register0x000013cc =
               fStack_17c * fVar108 +
               fStack_16c * fStack_35c + fStack_15c * (float)aStack_2bc + fStack_4c * fVar134;
          pfVar1 = (float *)(bezier_basis1 + lVar24 + lVar65 * 4);
          fVar136 = *pfVar1;
          fVar106 = pfVar1[1];
          fVar107 = pfVar1[2];
          fVar125 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21acb88 + lVar65 * 4);
          fVar126 = *pfVar1;
          fVar127 = pfVar1[1];
          fVar139 = pfVar1[2];
          fVar152 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21ad00c + lVar65 * 4);
          fVar154 = *pfVar1;
          fVar157 = pfVar1[1];
          fVar165 = pfVar1[2];
          fVar166 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21ad490 + lVar65 * 4);
          fVar191 = *pfVar1;
          fVar195 = pfVar1[1];
          local_3d8 = *(ulong *)pfVar1;
          fStack_3d0 = pfVar1[2];
          fStack_3cc = pfVar1[3];
          fVar225 = local_1e8 * fVar136 +
                    local_1f8 * fVar126 + local_378 * fVar154 + local_3c8 * fVar191;
          fVar226 = fStack_1e4 * fVar106 +
                    fStack_1f4 * fVar127 + fStack_374 * fVar157 + fStack_3c4 * fVar195;
          fVar227 = fStack_1e0 * fVar107 +
                    fStack_1f0 * fVar139 + fStack_370 * fVar165 + fStack_3c0 * fStack_3d0;
          fVar237 = fStack_1dc * fVar125 +
                    fStack_1ec * fVar152 + fStack_36c * fVar166 + fStack_3bc * fStack_3cc;
          fVar212 = local_198 * fVar136 + local_2a8 * fVar126 + fVar190 * fVar154 + fVar73 * fVar191
          ;
          fVar218 = fStack_194 * fVar106 +
                    fStack_2a4 * fVar127 + fVar190 * fVar157 + fVar73 * fVar195;
          fVar219 = fStack_190 * fVar107 +
                    fStack_2a0 * fVar139 + fVar190 * fVar165 + fVar73 * fStack_3d0;
          fVar262 = fStack_18c * fVar125 +
                    fStack_29c * fVar152 + fVar190 * fVar166 + fVar73 * fStack_3cc;
          auVar254._0_4_ =
               local_188 * fVar136 + local_178 * fVar126 + local_168 * fVar154 + local_58 * fVar191;
          auVar254._4_4_ =
               fStack_184 * fVar106 +
               fStack_174 * fVar127 + fStack_164 * fVar157 + fStack_54 * fVar195;
          auVar254._8_4_ =
               fStack_180 * fVar107 +
               fStack_170 * fVar139 + fStack_160 * fVar165 + fStack_50 * fStack_3d0;
          auVar254._12_4_ =
               fStack_17c * fVar125 +
               fStack_16c * fVar152 + fStack_15c * fVar166 + fStack_4c * fStack_3cc;
          fVar207 = fVar225 - local_1b8;
          fVar210 = fVar226 - fStack_1b4;
          fVar211 = fVar227 - fStack_1b0;
          fVar220 = fVar237 - fStack_1ac;
          fVar196 = fVar212 - local_1a8;
          fVar197 = fVar218 - fStack_1a4;
          fVar203 = fVar219 - fStack_1a0;
          fVar204 = fVar262 - fStack_19c;
          fVar240 = local_1a8 * fVar207 - local_1b8 * fVar196;
          fVar243 = fStack_1a4 * fVar210 - fStack_1b4 * fVar197;
          fVar246 = fStack_1a0 * fVar211 - fStack_1b0 * fVar203;
          fVar256 = fStack_19c * fVar220 - fStack_1ac * fVar204;
          auVar75 = maxps(_local_3b8,auVar254);
          bVar48 = fVar240 * fVar240 <=
                   auVar75._0_4_ * auVar75._0_4_ * (fVar207 * fVar207 + fVar196 * fVar196) &&
                   (int)uVar68 < local_88;
          auVar275._0_4_ = -(uint)bVar48;
          bVar49 = fVar243 * fVar243 <=
                   auVar75._4_4_ * auVar75._4_4_ * (fVar210 * fVar210 + fVar197 * fVar197) &&
                   (int)(uVar68 | 1) < iStack_84;
          auVar275._4_4_ = -(uint)bVar49;
          bVar50 = fVar246 * fVar246 <=
                   auVar75._8_4_ * auVar75._8_4_ * (fVar211 * fVar211 + fVar203 * fVar203) &&
                   (int)(uVar68 | 2) < iStack_80;
          auVar275._8_4_ = -(uint)bVar50;
          bVar51 = fVar256 * fVar256 <=
                   auVar75._12_4_ * auVar75._12_4_ * (fVar220 * fVar220 + fVar204 * fVar204) &&
                   (int)(uVar68 | 3) < iStack_7c;
          auVar275._12_4_ = -(uint)bVar51;
          uVar67 = movmskps(SUB84(auVar64,0),auVar275);
          auVar64 = (undefined1  [8])(ulong)uVar67;
          if (uVar67 != 0) {
            _local_218 = auVar254;
            local_258 = auVar275;
            local_78 = fVar207;
            fStack_74 = fVar210;
            fStack_70 = fVar211;
            fStack_6c = fVar220;
            local_68 = fVar196;
            fStack_64 = fVar197;
            fStack_60 = fVar203;
            fStack_5c = fVar204;
            fVar257 = fVar191 * local_388 + fVar154 * local_3a8 + fVar126 * fVar189 +
                      fVar136 * fVar167;
            fVar259 = fVar195 * fStack_384 + fVar157 * fStack_3a4 + fVar127 * fVar189 +
                      fVar106 * fVar167;
            fStack_3d0 = fStack_3d0 * fStack_380 + fVar165 * fStack_3a0 + fVar139 * fVar189 +
                         fVar107 * fVar167;
            fStack_3cc = fStack_3cc * fStack_37c + fVar166 * fStack_39c + fVar152 * fVar189 +
                         fVar125 * fVar167;
            local_3d8 = CONCAT44(fVar259,fVar257);
            local_358._0_4_ = auVar28._0_4_;
            local_358._4_4_ = auVar28._4_4_;
            fStack_350 = auVar28._8_4_;
            local_3e8._0_4_ = auVar27._0_4_;
            local_3e8._4_4_ = auVar27._4_4_;
            fStack_3e0 = auVar27._8_4_;
            fVar137 = (float)local_3e8._0_4_ * local_388 + local_2c8 * local_3a8 +
                      local_368 * fVar189 + (float)local_358._0_4_ * fVar167;
            fVar138 = (float)local_3e8._4_4_ * fStack_384 + fStack_2c4 * fStack_3a4 +
                      fStack_364 * fVar189 + (float)local_358._4_4_ * fVar167;
            fVar140 = fStack_3e0 * fStack_380 + fStack_2c0 * fStack_3a0 + fStack_360 * fVar189 +
                      fStack_350 * fVar167;
            fVar153 = fVar134 * fStack_37c + (float)aStack_2bc * fStack_39c + fStack_35c * fVar189 +
                      fVar108 * fVar167;
            pfVar1 = (float *)(lVar24 + 0x21ab4f4 + lVar65 * 4);
            fVar136 = *pfVar1;
            fVar106 = pfVar1[1];
            fVar107 = pfVar1[2];
            fVar108 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21ab978 + lVar65 * 4);
            fVar125 = *pfVar1;
            fVar126 = pfVar1[1];
            fVar127 = pfVar1[2];
            fVar134 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21abdfc + lVar65 * 4);
            fVar139 = *pfVar1;
            fVar152 = pfVar1[1];
            fVar154 = pfVar1[2];
            fVar157 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21ac280 + lVar65 * 4);
            fVar165 = *pfVar1;
            fVar166 = pfVar1[1];
            fVar191 = pfVar1[2];
            fVar195 = pfVar1[3];
            fVar241 = local_1e8 * fVar136 +
                      local_1f8 * fVar125 + local_378 * fVar139 + local_3c8 * fVar165;
            fVar244 = fStack_1e4 * fVar106 +
                      fStack_1f4 * fVar126 + fStack_374 * fVar152 + fStack_3c4 * fVar166;
            fVar273 = fStack_1e0 * fVar107 +
                      fStack_1f0 * fVar127 + fStack_370 * fVar154 + fStack_3c0 * fVar191;
            fVar277 = fStack_1dc * fVar108 +
                      fStack_1ec * fVar134 + fStack_36c * fVar157 + fStack_3bc * fVar195;
            fVar261 = local_198 * fVar136 +
                      local_2a8 * fVar125 + fVar190 * fVar139 + fVar73 * fVar165;
            fVar270 = fStack_194 * fVar106 +
                      fStack_2a4 * fVar126 + fVar190 * fVar152 + fVar73 * fVar166;
            fVar128 = fStack_190 * fVar107 +
                      fStack_2a0 * fVar127 + fVar190 * fVar154 + fVar73 * fVar191;
            fVar135 = fStack_18c * fVar108 +
                      fStack_29c * fVar134 + fVar190 * fVar157 + fVar73 * fVar195;
            pfVar1 = (float *)(lVar24 + 0x21ad914 + lVar65 * 4);
            fVar240 = *pfVar1;
            fVar243 = pfVar1[1];
            fVar246 = pfVar1[2];
            fVar256 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21ae21c + lVar65 * 4);
            fVar258 = *pfVar1;
            fVar260 = pfVar1[1];
            fVar263 = pfVar1[2];
            fVar268 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21ae6a0 + lVar65 * 4);
            fVar269 = *pfVar1;
            fVar271 = pfVar1[1];
            fVar205 = pfVar1[2];
            fVar206 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21add98 + lVar65 * 4);
            fVar239 = *pfVar1;
            fVar242 = pfVar1[1];
            fVar245 = pfVar1[2];
            fVar247 = pfVar1[3];
            fVar278 = local_1e8 * fVar240 +
                      local_1f8 * fVar239 + local_378 * fVar258 + local_3c8 * fVar269;
            fVar279 = fStack_1e4 * fVar243 +
                      fStack_1f4 * fVar242 + fStack_374 * fVar260 + fStack_3c4 * fVar271;
            fVar280 = fStack_1e0 * fVar246 +
                      fStack_1f0 * fVar245 + fStack_370 * fVar263 + fStack_3c0 * fVar205;
            fVar281 = fStack_1dc * fVar256 +
                      fStack_1ec * fVar247 + fStack_36c * fVar268 + fStack_3bc * fVar206;
            fVar155 = local_198 * fVar240 +
                      local_2a8 * fVar239 + fVar190 * fVar258 + fVar73 * fVar269;
            fVar156 = fStack_194 * fVar243 +
                      fStack_2a4 * fVar242 + fVar190 * fVar260 + fVar73 * fVar271;
            fVar228 = fStack_190 * fVar246 +
                      fStack_2a0 * fVar245 + fVar190 * fVar263 + fVar73 * fVar205;
            fVar238 = fStack_18c * fVar256 +
                      fStack_29c * fVar247 + fVar190 * fVar268 + fVar73 * fVar206;
            auVar255._0_8_ = CONCAT44(fVar244,fVar241) & 0x7fffffff7fffffff;
            auVar255._8_4_ = ABS(fVar273);
            auVar255._12_4_ = ABS(fVar277);
            auVar186._0_8_ = CONCAT44(fVar270,fVar261) & 0x7fffffff7fffffff;
            auVar186._8_4_ = ABS(fVar128);
            auVar186._12_4_ = ABS(fVar135);
            auVar75 = maxps(auVar255,auVar186);
            auVar266._0_8_ =
                 CONCAT44(fVar106 * fVar167 +
                          fVar126 * fVar189 + fVar152 * fStack_3a4 + fVar166 * fStack_384,
                          fVar136 * fVar167 +
                          fVar125 * fVar189 + fVar139 * local_3a8 + fVar165 * local_388) &
                 0x7fffffff7fffffff;
            auVar266._8_4_ =
                 ABS(fVar107 * fVar167 +
                     fVar127 * fVar189 + fVar154 * fStack_3a0 + fVar191 * fStack_380);
            auVar266._12_4_ =
                 ABS(fVar108 * fVar167 +
                     fVar134 * fVar189 + fVar157 * fStack_39c + fVar195 * fStack_37c);
            auVar75 = maxps(auVar75,auVar266);
            uVar67 = -(uint)(local_308 <= auVar75._0_4_);
            uVar69 = -(uint)(fStack_304 <= auVar75._4_4_);
            uVar70 = -(uint)(fStack_300 <= auVar75._8_4_);
            uVar71 = -(uint)(fStack_2fc <= auVar75._12_4_);
            auVar187._0_4_ = ~uVar67 & (uint)fVar207;
            auVar187._4_4_ = ~uVar69 & (uint)fVar210;
            auVar187._8_4_ = ~uVar70 & (uint)fVar211;
            auVar187._12_4_ = ~uVar71 & (uint)fVar220;
            auVar236._0_4_ = (uint)fVar241 & uVar67;
            auVar236._4_4_ = (uint)fVar244 & uVar69;
            auVar236._8_4_ = (uint)fVar273 & uVar70;
            auVar236._12_4_ = (uint)fVar277 & uVar71;
            auVar236 = auVar236 | auVar187;
            fVar152 = (float)(~uVar67 & (uint)fVar196 | (uint)fVar261 & uVar67);
            fVar154 = (float)(~uVar69 & (uint)fVar197 | (uint)fVar270 & uVar69);
            fVar157 = (float)(~uVar70 & (uint)fVar203 | (uint)fVar128 & uVar70);
            fVar261 = (float)(~uVar71 & (uint)fVar204 | (uint)fVar135 & uVar71);
            auVar267._0_8_ = CONCAT44(fVar279,fVar278) & 0x7fffffff7fffffff;
            auVar267._8_4_ = ABS(fVar280);
            auVar267._12_4_ = ABS(fVar281);
            auVar131._0_8_ = CONCAT44(fVar156,fVar155) & 0x7fffffff7fffffff;
            auVar131._8_4_ = ABS(fVar228);
            auVar131._12_4_ = ABS(fVar238);
            auVar75 = maxps(auVar267,auVar131);
            auVar102._0_8_ =
                 CONCAT44(fVar243 * fVar167 +
                          fVar242 * fVar189 + fVar260 * fStack_3a4 + fVar271 * fStack_384,
                          fVar240 * fVar167 +
                          fVar239 * fVar189 + fVar258 * local_3a8 + fVar269 * local_388) &
                 0x7fffffff7fffffff;
            auVar102._8_4_ =
                 ABS(fVar246 * fVar167 +
                     fVar245 * fVar189 + fVar263 * fStack_3a0 + fVar205 * fStack_380);
            auVar102._12_4_ =
                 ABS(fVar256 * fVar167 +
                     fVar247 * fVar189 + fVar268 * fStack_39c + fVar206 * fStack_37c);
            auVar75 = maxps(auVar75,auVar102);
            uVar67 = -(uint)(local_308 <= auVar75._0_4_);
            uVar69 = -(uint)(fStack_304 <= auVar75._4_4_);
            uVar70 = -(uint)(fStack_300 <= auVar75._8_4_);
            uVar71 = -(uint)(fStack_2fc <= auVar75._12_4_);
            fVar243 = (float)((uint)fVar278 & uVar67 | ~uVar67 & (uint)fVar207);
            fVar258 = (float)((uint)fVar279 & uVar69 | ~uVar69 & (uint)fVar210);
            fVar260 = (float)((uint)fVar280 & uVar70 | ~uVar70 & (uint)fVar211);
            fVar263 = (float)((uint)fVar281 & uVar71 | ~uVar71 & (uint)fVar220);
            fVar210 = (float)(~uVar67 & (uint)fVar196 | (uint)fVar155 & uVar67);
            fVar211 = (float)(~uVar69 & (uint)fVar197 | (uint)fVar156 & uVar69);
            fVar220 = (float)(~uVar70 & (uint)fVar203 | (uint)fVar228 & uVar70);
            fVar240 = (float)(~uVar71 & (uint)fVar204 | (uint)fVar238 & uVar71);
            fVar139 = auVar236._0_4_;
            fVar136 = auVar236._4_4_;
            fVar106 = auVar236._8_4_;
            fVar107 = auVar236._12_4_;
            auVar161._0_4_ = fVar152 * fVar152 + fVar139 * fVar139;
            auVar161._4_4_ = fVar154 * fVar154 + fVar136 * fVar136;
            auVar161._8_4_ = fVar157 * fVar157 + fVar106 * fVar106;
            auVar161._12_4_ = fVar261 * fVar261 + fVar107 * fVar107;
            auVar75 = rsqrtps(auVar187,auVar161);
            fVar108 = auVar75._0_4_;
            fVar125 = auVar75._4_4_;
            fVar126 = auVar75._8_4_;
            fVar127 = auVar75._12_4_;
            auVar188._0_4_ = fVar108 * fVar108 * auVar161._0_4_ * 0.5 * fVar108;
            auVar188._4_4_ = fVar125 * fVar125 * auVar161._4_4_ * 0.5 * fVar125;
            auVar188._8_4_ = fVar126 * fVar126 * auVar161._8_4_ * 0.5 * fVar126;
            auVar188._12_4_ = fVar127 * fVar127 * auVar161._12_4_ * 0.5 * fVar127;
            fVar134 = fVar108 * 1.5 - auVar188._0_4_;
            fVar196 = fVar125 * 1.5 - auVar188._4_4_;
            fVar203 = fVar126 * 1.5 - auVar188._8_4_;
            fVar207 = fVar127 * 1.5 - auVar188._12_4_;
            auVar162._0_4_ = fVar210 * fVar210 + fVar243 * fVar243;
            auVar162._4_4_ = fVar211 * fVar211 + fVar258 * fVar258;
            auVar162._8_4_ = fVar220 * fVar220 + fVar260 * fVar260;
            auVar162._12_4_ = fVar240 * fVar240 + fVar263 * fVar263;
            auVar75 = rsqrtps(auVar188,auVar162);
            fVar108 = auVar75._0_4_;
            fVar125 = auVar75._4_4_;
            fVar126 = auVar75._8_4_;
            fVar127 = auVar75._12_4_;
            fVar165 = fVar108 * 1.5 - fVar108 * fVar108 * auVar162._0_4_ * 0.5 * fVar108;
            fVar166 = fVar125 * 1.5 - fVar125 * fVar125 * auVar162._4_4_ * 0.5 * fVar125;
            fVar191 = fVar126 * 1.5 - fVar126 * fVar126 * auVar162._8_4_ * 0.5 * fVar126;
            fVar195 = fVar127 * 1.5 - fVar127 * fVar127 * auVar162._12_4_ * 0.5 * fVar127;
            fVar269 = fVar152 * fVar134 * (float)local_3b8;
            fVar205 = fVar154 * fVar196 * (float)auStack_3b4._0_4_;
            fVar239 = fVar157 * fVar203 * (float)auStack_3b4._4_4_;
            fVar245 = fVar261 * fVar207 * register0x000013cc;
            fVar139 = -fVar139 * fVar134 * (float)local_3b8;
            fVar152 = -fVar136 * fVar196 * (float)auStack_3b4._0_4_;
            fVar154 = -fVar106 * fVar203 * (float)auStack_3b4._4_4_;
            fVar157 = -fVar107 * fVar207 * register0x000013cc;
            fVar197 = fVar134 * 0.0 * (float)local_3b8;
            fVar204 = fVar196 * 0.0 * (float)auStack_3b4._0_4_;
            fVar246 = fVar203 * 0.0 * (float)auStack_3b4._4_4_;
            fVar256 = fVar207 * 0.0 * register0x000013cc;
            local_358._0_4_ = fVar137 + fVar197;
            local_358._4_4_ = fVar138 + fVar204;
            fStack_350 = fVar140 + fVar246;
            fStack_34c = fVar153 + fVar256;
            fVar261 = fVar210 * fVar165 * auVar254._0_4_;
            fVar270 = fVar211 * fVar166 * auVar254._4_4_;
            fVar128 = fVar220 * fVar191 * auVar254._8_4_;
            fVar135 = fVar240 * fVar195 * auVar254._12_4_;
            fVar136 = fVar225 + fVar261;
            fVar106 = fVar226 + fVar270;
            fVar107 = fVar227 + fVar128;
            fVar108 = fVar237 + fVar135;
            fVar125 = -fVar243 * fVar165 * auVar254._0_4_;
            fVar126 = -fVar258 * fVar166 * auVar254._4_4_;
            fVar127 = -fVar260 * fVar191 * auVar254._8_4_;
            fVar134 = -fVar263 * fVar195 * auVar254._12_4_;
            fVar258 = fVar212 + fVar125;
            fVar260 = fVar218 + fVar126;
            fVar263 = fVar219 + fVar127;
            fVar268 = fVar262 + fVar134;
            fVar165 = fVar165 * 0.0 * auVar254._0_4_;
            fVar166 = fVar166 * 0.0 * auVar254._4_4_;
            fVar191 = fVar191 * 0.0 * auVar254._8_4_;
            fVar195 = fVar195 * 0.0 * auVar254._12_4_;
            fVar211 = local_1b8 - fVar269;
            fVar220 = fStack_1b4 - fVar205;
            fVar240 = fStack_1b0 - fVar239;
            fVar243 = fStack_1ac - fVar245;
            fVar271 = fVar257 + fVar165;
            fVar206 = fVar259 + fVar166;
            fVar242 = fStack_3d0 + fVar191;
            fVar247 = fStack_3cc + fVar195;
            fVar196 = local_1a8 - fVar139;
            fVar203 = fStack_1a4 - fVar152;
            fVar207 = fStack_1a0 - fVar154;
            fVar210 = fStack_19c - fVar157;
            fVar137 = fVar137 - fVar197;
            fVar138 = fVar138 - fVar204;
            fVar140 = fVar140 - fVar246;
            fVar153 = fVar153 - fVar256;
            uVar67 = -(uint)(0.0 < (fVar196 * (fVar271 - fVar137) - fVar137 * (fVar258 - fVar196)) *
                                   0.0 + (fVar137 * (fVar136 - fVar211) -
                                         (fVar271 - fVar137) * fVar211) * 0.0 +
                                         ((fVar258 - fVar196) * fVar211 -
                                         (fVar136 - fVar211) * fVar196));
            uVar69 = -(uint)(0.0 < (fVar203 * (fVar206 - fVar138) - fVar138 * (fVar260 - fVar203)) *
                                   0.0 + (fVar138 * (fVar106 - fVar220) -
                                         (fVar206 - fVar138) * fVar220) * 0.0 +
                                         ((fVar260 - fVar203) * fVar220 -
                                         (fVar106 - fVar220) * fVar203));
            uVar70 = -(uint)(0.0 < (fVar207 * (fVar242 - fVar140) - fVar140 * (fVar263 - fVar207)) *
                                   0.0 + (fVar140 * (fVar107 - fVar240) -
                                         (fVar242 - fVar140) * fVar240) * 0.0 +
                                         ((fVar263 - fVar207) * fVar240 -
                                         (fVar107 - fVar240) * fVar207));
            uVar71 = -(uint)(0.0 < (fVar210 * (fVar247 - fVar153) - fVar153 * (fVar268 - fVar210)) *
                                   0.0 + (fVar153 * (fVar108 - fVar243) -
                                         (fVar247 - fVar153) * fVar243) * 0.0 +
                                         ((fVar268 - fVar210) * fVar243 -
                                         (fVar108 - fVar243) * fVar210));
            local_3e8._0_4_ =
                 (uint)(fVar225 - fVar261) & uVar67 | ~uVar67 & (uint)(local_1b8 + fVar269);
            local_3e8._4_4_ =
                 (uint)(fVar226 - fVar270) & uVar69 | ~uVar69 & (uint)(fStack_1b4 + fVar205);
            fStack_3e0 = (float)((uint)(fVar227 - fVar128) & uVar70 |
                                ~uVar70 & (uint)(fStack_1b0 + fVar239));
            fStack_3dc = (float)((uint)(fVar237 - fVar135) & uVar71 |
                                ~uVar71 & (uint)(fStack_1ac + fVar245));
            fVar227 = (float)((uint)(fVar212 - fVar125) & uVar67 |
                             ~uVar67 & (uint)(local_1a8 + fVar139));
            fVar237 = (float)((uint)(fVar218 - fVar126) & uVar69 |
                             ~uVar69 & (uint)(fStack_1a4 + fVar152));
            fVar246 = (float)((uint)(fVar219 - fVar127) & uVar70 |
                             ~uVar70 & (uint)(fStack_1a0 + fVar154));
            fVar256 = (float)((uint)(fVar262 - fVar134) & uVar71 |
                             ~uVar71 & (uint)(fStack_19c + fVar157));
            fVar125 = (float)((uint)(fVar257 - fVar165) & uVar67 | ~uVar67 & local_358._0_4_);
            fVar126 = (float)((uint)(fVar259 - fVar166) & uVar69 | ~uVar69 & local_358._4_4_);
            fVar127 = (float)((uint)(fStack_3d0 - fVar191) & uVar70 | ~uVar70 & (uint)fStack_350);
            fVar134 = (float)((uint)(fStack_3cc - fVar195) & uVar71 | ~uVar71 & (uint)fStack_34c);
            fVar219 = (float)((uint)fVar211 & uVar67 | ~uVar67 & (uint)fVar136);
            fVar262 = (float)((uint)fVar220 & uVar69 | ~uVar69 & (uint)fVar106);
            fVar225 = (float)((uint)fVar240 & uVar70 | ~uVar70 & (uint)fVar107);
            fVar226 = (float)((uint)fVar243 & uVar71 | ~uVar71 & (uint)fVar108);
            fVar197 = (float)((uint)fVar196 & uVar67 | ~uVar67 & (uint)fVar258);
            fVar204 = (float)((uint)fVar203 & uVar69 | ~uVar69 & (uint)fVar260);
            fVar212 = (float)((uint)fVar207 & uVar70 | ~uVar70 & (uint)fVar263);
            fVar218 = (float)((uint)fVar210 & uVar71 | ~uVar71 & (uint)fVar268);
            fVar165 = (float)((uint)fVar137 & uVar67 | ~uVar67 & (uint)fVar271);
            fVar166 = (float)((uint)fVar138 & uVar69 | ~uVar69 & (uint)fVar206);
            fVar191 = (float)((uint)fVar140 & uVar70 | ~uVar70 & (uint)fVar242);
            fVar195 = (float)((uint)fVar153 & uVar71 | ~uVar71 & (uint)fVar247);
            fVar211 = (float)((uint)fVar136 & uVar67 | ~uVar67 & (uint)fVar211) -
                      (float)local_3e8._0_4_;
            fVar220 = (float)((uint)fVar106 & uVar69 | ~uVar69 & (uint)fVar220) -
                      (float)local_3e8._4_4_;
            fVar240 = (float)((uint)fVar107 & uVar70 | ~uVar70 & (uint)fVar240) - fStack_3e0;
            fVar243 = (float)((uint)fVar108 & uVar71 | ~uVar71 & (uint)fVar243) - fStack_3dc;
            fVar196 = (float)((uint)fVar258 & uVar67 | ~uVar67 & (uint)fVar196) - fVar227;
            fVar203 = (float)((uint)fVar260 & uVar69 | ~uVar69 & (uint)fVar203) - fVar237;
            fVar207 = (float)((uint)fVar263 & uVar70 | ~uVar70 & (uint)fVar207) - fVar246;
            fVar210 = (float)((uint)fVar268 & uVar71 | ~uVar71 & (uint)fVar210) - fVar256;
            fVar258 = (float)((uint)fVar271 & uVar67 | ~uVar67 & (uint)fVar137) - fVar125;
            fVar260 = (float)((uint)fVar206 & uVar69 | ~uVar69 & (uint)fVar138) - fVar126;
            fVar263 = (float)((uint)fVar242 & uVar70 | ~uVar70 & (uint)fVar140) - fVar127;
            fVar268 = (float)((uint)fVar247 & uVar71 | ~uVar71 & (uint)fVar153) - fVar134;
            fVar239 = (float)local_3e8._0_4_ - fVar219;
            fVar242 = (float)local_3e8._4_4_ - fVar262;
            fVar245 = fStack_3e0 - fVar225;
            fVar247 = fStack_3dc - fVar226;
            fVar136 = fVar227 - fVar197;
            fVar106 = fVar237 - fVar204;
            fVar107 = fVar246 - fVar212;
            fVar108 = fVar256 - fVar218;
            fVar139 = fVar125 - fVar165;
            fVar152 = fVar126 - fVar166;
            fVar154 = fVar127 - fVar191;
            fVar157 = fVar134 - fVar195;
            fVar269 = (fVar227 * fVar258 - fVar125 * fVar196) * 0.0 +
                      (fVar125 * fVar211 - (float)local_3e8._0_4_ * fVar258) * 0.0 +
                      ((float)local_3e8._0_4_ * fVar196 - fVar227 * fVar211);
            fVar271 = (fVar237 * fVar260 - fVar126 * fVar203) * 0.0 +
                      (fVar126 * fVar220 - (float)local_3e8._4_4_ * fVar260) * 0.0 +
                      ((float)local_3e8._4_4_ * fVar203 - fVar237 * fVar220);
            auVar150._4_4_ = fVar271;
            auVar150._0_4_ = fVar269;
            fVar205 = (fVar246 * fVar263 - fVar127 * fVar207) * 0.0 +
                      (fVar127 * fVar240 - fStack_3e0 * fVar263) * 0.0 +
                      (fStack_3e0 * fVar207 - fVar246 * fVar240);
            fVar206 = (fVar256 * fVar268 - fVar134 * fVar210) * 0.0 +
                      (fVar134 * fVar243 - fStack_3dc * fVar268) * 0.0 +
                      (fStack_3dc * fVar210 - fVar256 * fVar243);
            auVar276._0_4_ =
                 (fVar197 * fVar139 - fVar165 * fVar136) * 0.0 +
                 (fVar165 * fVar239 - fVar219 * fVar139) * 0.0 +
                 (fVar219 * fVar136 - fVar197 * fVar239);
            auVar276._4_4_ =
                 (fVar204 * fVar152 - fVar166 * fVar106) * 0.0 +
                 (fVar166 * fVar242 - fVar262 * fVar152) * 0.0 +
                 (fVar262 * fVar106 - fVar204 * fVar242);
            auVar276._8_4_ =
                 (fVar212 * fVar154 - fVar191 * fVar107) * 0.0 +
                 (fVar191 * fVar245 - fVar225 * fVar154) * 0.0 +
                 (fVar225 * fVar107 - fVar212 * fVar245);
            auVar276._12_4_ =
                 (fVar218 * fVar157 - fVar195 * fVar108) * 0.0 +
                 (fVar195 * fVar247 - fVar226 * fVar157) * 0.0 +
                 (fVar226 * fVar108 - fVar218 * fVar247);
            auVar150._8_4_ = fVar205;
            auVar150._12_4_ = fVar206;
            auVar75 = maxps(auVar150,auVar276);
            bVar48 = auVar75._0_4_ <= 0.0 && bVar48;
            auVar151._0_4_ = -(uint)bVar48;
            bVar49 = auVar75._4_4_ <= 0.0 && bVar49;
            auVar151._4_4_ = -(uint)bVar49;
            bVar50 = auVar75._8_4_ <= 0.0 && bVar50;
            auVar151._8_4_ = -(uint)bVar50;
            bVar51 = auVar75._12_4_ <= 0.0 && bVar51;
            auVar151._12_4_ = -(uint)bVar51;
            iVar53 = movmskps((int)(bezier_basis1 + lVar24),auVar151);
            if (iVar53 == 0) {
LAB_00b27bef:
              auVar133._8_8_ = uStack_310;
              auVar133._0_8_ = local_318;
            }
            else {
              fVar165 = ray->tfar;
              fVar166 = fVar136 * fVar258 - fVar139 * fVar196;
              fVar191 = fVar106 * fVar260 - fVar152 * fVar203;
              fVar195 = fVar107 * fVar263 - fVar154 * fVar207;
              fVar197 = fVar108 * fVar268 - fVar157 * fVar210;
              fVar139 = fVar139 * fVar211 - fVar258 * fVar239;
              fVar152 = fVar152 * fVar220 - fVar260 * fVar242;
              fVar154 = fVar154 * fVar240 - fVar263 * fVar245;
              fVar157 = fVar157 * fVar243 - fVar268 * fVar247;
              fVar196 = fVar239 * fVar196 - fVar136 * fVar211;
              fVar203 = fVar242 * fVar203 - fVar106 * fVar220;
              fVar204 = fVar245 * fVar207 - fVar107 * fVar240;
              fVar212 = fVar247 * fVar210 - fVar108 * fVar243;
              auVar132._0_4_ = fVar139 * 0.0 + fVar196;
              auVar132._4_4_ = fVar152 * 0.0 + fVar203;
              auVar132._8_4_ = fVar154 * 0.0 + fVar204;
              auVar132._12_4_ = fVar157 * 0.0 + fVar212;
              auVar194._0_4_ = fVar166 * 0.0 + auVar132._0_4_;
              auVar194._4_4_ = fVar191 * 0.0 + auVar132._4_4_;
              auVar194._8_4_ = fVar195 * 0.0 + auVar132._8_4_;
              auVar194._12_4_ = fVar197 * 0.0 + auVar132._12_4_;
              auVar75 = rcpps(auVar132,auVar194);
              fVar136 = auVar75._0_4_;
              fVar106 = auVar75._4_4_;
              fVar107 = auVar75._8_4_;
              fVar108 = auVar75._12_4_;
              fVar136 = (1.0 - auVar194._0_4_ * fVar136) * fVar136 + fVar136;
              fVar106 = (1.0 - auVar194._4_4_ * fVar106) * fVar106 + fVar106;
              fVar107 = (1.0 - auVar194._8_4_ * fVar107) * fVar107 + fVar107;
              fVar108 = (1.0 - auVar194._12_4_ * fVar108) * fVar108 + fVar108;
              fVar125 = (fVar125 * fVar196 + fVar227 * fVar139 + (float)local_3e8._0_4_ * fVar166) *
                        fVar136;
              fVar126 = (fVar126 * fVar203 + fVar237 * fVar152 + (float)local_3e8._4_4_ * fVar191) *
                        fVar106;
              fVar127 = (fVar127 * fVar204 + fVar246 * fVar154 + fStack_3e0 * fVar195) * fVar107;
              fVar134 = (fVar134 * fVar212 + fVar256 * fVar157 + fStack_3dc * fVar197) * fVar108;
              bVar48 = (local_208 <= fVar125 && fVar125 <= fVar165) && bVar48;
              auVar163._0_4_ = -(uint)bVar48;
              bVar49 = (fStack_204 <= fVar126 && fVar126 <= fVar165) && bVar49;
              auVar163._4_4_ = -(uint)bVar49;
              bVar50 = (fStack_200 <= fVar127 && fVar127 <= fVar165) && bVar50;
              auVar163._8_4_ = -(uint)bVar50;
              bVar51 = (fStack_1fc <= fVar134 && fVar134 <= fVar165) && bVar51;
              auVar163._12_4_ = -(uint)bVar51;
              iVar53 = movmskps(iVar53,auVar163);
              if (iVar53 == 0) goto LAB_00b27bef;
              auVar164._0_8_ =
                   CONCAT44(-(uint)(auVar194._4_4_ != 0.0 && bVar49),
                            -(uint)(auVar194._0_4_ != 0.0 && bVar48));
              auVar164._8_4_ = -(uint)(auVar194._8_4_ != 0.0 && bVar50);
              auVar164._12_4_ = -(uint)(auVar194._12_4_ != 0.0 && bVar51);
              iVar53 = movmskps(iVar53,auVar164);
              auVar133._8_8_ = uStack_310;
              auVar133._0_8_ = local_318;
              if (iVar53 != 0) {
                fVar269 = fVar269 * fVar136;
                fVar271 = fVar271 * fVar106;
                fVar205 = fVar205 * fVar107;
                fVar206 = fVar206 * fVar108;
                local_3f8 = (float)((uint)(1.0 - fVar269) & uVar67 | ~uVar67 & (uint)fVar269);
                fStack_3f4 = (float)((uint)(1.0 - fVar271) & uVar69 | ~uVar69 & (uint)fVar271);
                fStack_3f0 = (float)((uint)(1.0 - fVar205) & uVar70 | ~uVar70 & (uint)fVar205);
                fStack_3ec = (float)((uint)(1.0 - fVar206) & uVar71 | ~uVar71 & (uint)fVar206);
                local_1d8 = (float)(~uVar67 & (uint)(auVar276._0_4_ * fVar136) |
                                   (uint)(1.0 - auVar276._0_4_ * fVar136) & uVar67);
                fStack_1d4 = (float)(~uVar69 & (uint)(auVar276._4_4_ * fVar106) |
                                    (uint)(1.0 - auVar276._4_4_ * fVar106) & uVar69);
                fStack_1d0 = (float)(~uVar70 & (uint)(auVar276._8_4_ * fVar107) |
                                    (uint)(1.0 - auVar276._8_4_ * fVar107) & uVar70);
                fStack_1cc = (float)(~uVar71 & (uint)(auVar276._12_4_ * fVar108) |
                                    (uint)(1.0 - auVar276._12_4_ * fVar108) & uVar71);
                auVar133._8_4_ = auVar164._8_4_;
                auVar133._0_8_ = auVar164._0_8_;
                auVar133._12_4_ = auVar164._12_4_;
                local_408 = fVar125;
                fStack_404 = fVar126;
                fStack_400 = fVar127;
                fStack_3fc = fVar134;
              }
            }
            iVar53 = movmskps(iVar53,auVar133);
            if (iVar53 != 0) {
              fVar106 = (auVar254._0_4_ - (float)local_3b8) * local_3f8 + (float)local_3b8;
              fVar107 = (auVar254._4_4_ - (float)auStack_3b4._0_4_) * fStack_3f4 +
                        (float)auStack_3b4._0_4_;
              fVar108 = (auVar254._8_4_ - (float)auStack_3b4._4_4_) * fStack_3f0 +
                        (float)auStack_3b4._4_4_;
              fVar125 = (auVar254._12_4_ - register0x000013cc) * fStack_3ec + register0x000013cc;
              fVar136 = local_320->depth_scale;
              auVar103._0_4_ = -(uint)(fVar136 * (fVar106 + fVar106) < local_408) & auVar133._0_4_;
              auVar103._4_4_ = -(uint)(fVar136 * (fVar107 + fVar107) < fStack_404) & auVar133._4_4_;
              auVar103._8_4_ = -(uint)(fVar136 * (fVar108 + fVar108) < fStack_400) & auVar133._8_4_;
              auVar103._12_4_ =
                   -(uint)(fVar136 * (fVar125 + fVar125) < fStack_3fc) & auVar133._12_4_;
              uVar67 = movmskps((int)local_320,auVar103);
              if (uVar67 != 0) {
                local_1d8 = local_1d8 + local_1d8 + -1.0;
                fStack_1d4 = fStack_1d4 + fStack_1d4 + -1.0;
                fStack_1d0 = fStack_1d0 + fStack_1d0 + -1.0;
                fStack_1cc = fStack_1cc + fStack_1cc + -1.0;
                local_158 = local_3f8;
                fStack_154 = fStack_3f4;
                fStack_150 = fStack_3f0;
                fStack_14c = fStack_3ec;
                local_148 = local_1d8;
                fStack_144 = fStack_1d4;
                fStack_140 = fStack_1d0;
                fStack_13c = fStack_1cc;
                local_138 = local_408;
                fStack_134 = fStack_404;
                fStack_130 = fStack_400;
                fStack_12c = fStack_3fc;
                local_128 = uVar68;
                local_124 = iVar19;
                local_118 = CONCAT44(fStack_2b4,local_2b8);
                uStack_110 = CONCAT44(fStack_2ac,fStack_2b0);
                local_108 = CONCAT44(fStack_234,local_238);
                uStack_100 = CONCAT44(fStack_22c,fStack_230);
                local_f8 = CONCAT44(fStack_244,local_248);
                uStack_f0 = CONCAT44(fStack_23c,fStack_240);
                local_e8 = CONCAT44(fStack_224,local_228);
                uStack_e0 = CONCAT44(fStack_21c,fStack_220);
                local_d8 = auVar103;
                auVar64 = (undefined1  [8])(context->scene->geometries).items[local_328].ptr;
                if ((((Geometry *)auVar64)->mask & ray->mask) == 0) {
                  puVar61 = (undefined1 *)0x0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (puVar61 = (undefined1 *)CONCAT71((int7)((ulong)context->args >> 8),1),
                        ((Geometry *)auVar64)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar136 = (float)(int)uVar68;
                  local_c8[0] = (fVar136 + local_3f8 + 0.0) * local_98;
                  local_c8[1] = (fVar136 + fStack_3f4 + 1.0) * fStack_94;
                  local_c8[2] = (fVar136 + fStack_3f0 + 2.0) * fStack_90;
                  local_c8[3] = (fVar136 + fStack_3ec + 3.0) * fStack_8c;
                  local_b8 = CONCAT44(fStack_1d4,local_1d8);
                  uStack_b0 = CONCAT44(fStack_1cc,fStack_1d0);
                  local_a8[0] = local_408;
                  local_a8[1] = fStack_404;
                  local_a8[2] = fStack_400;
                  local_a8[3] = fStack_3fc;
                  local_468 = (ulong)(uVar67 & 0xff);
                  uVar56 = 0;
                  if (local_468 != 0) {
                    for (; ((uVar67 & 0xff) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                    }
                  }
                  local_3b8 = (undefined1  [4])ray->tfar;
                  local_3e8 = auVar64;
                  do {
                    local_28c = local_c8[uVar56];
                    local_288 = *(undefined4 *)((long)&local_b8 + uVar56 * 4);
                    local_3d8 = uVar56;
                    ray->tfar = local_a8[uVar56];
                    local_2f8._16_8_ = context->user;
                    fVar136 = 1.0 - local_28c;
                    fVar107 = local_28c * fVar136 + local_28c * fVar136;
                    fVar106 = fVar136 * fVar136 * -3.0;
                    fVar108 = (fVar136 * fVar136 - fVar107) * 3.0;
                    fVar136 = (fVar107 - local_28c * local_28c) * 3.0;
                    fVar107 = local_28c * local_28c * 3.0;
                    local_298 = CONCAT44(fVar106 * fStack_2b4 +
                                         fVar108 * fStack_234 +
                                         fVar136 * fStack_244 + fVar107 * fStack_224,
                                         fVar106 * local_2b8 +
                                         fVar108 * local_238 +
                                         fVar136 * local_248 + fVar107 * local_228);
                    local_290 = fVar106 * fStack_2b0 +
                                fVar108 * fStack_230 + fVar136 * fStack_240 + fVar107 * fStack_220;
                    local_284 = (int)local_260;
                    local_280 = (int)local_328;
                    local_27c = *(uint *)&(((Device *)local_2f8._16_8_)->super_State).super_RefCount
                                          ._vptr_RefCount;
                    local_278 = *(uint *)((long)&(((Device *)local_2f8._16_8_)->super_State).
                                                 super_RefCount._vptr_RefCount + 4);
                    local_40c = -1;
                    local_2f8._0_8_ = &local_40c;
                    local_2f8._8_8_ = ((Geometry *)auVar64)->userPtr;
                    local_2f8._24_8_ = ray;
                    local_2f8._32_8_ = &local_298;
                    local_2d0 = 1.4013e-45;
                    pp_Var52 = &((Geometry *)auVar64)->occlusionFilterN;
                    if (*pp_Var52 == (RTCFilterFunctionN)0x0) {
LAB_00b27ae9:
                      pRVar59 = context->args;
                      auVar62 = (undefined1  [8])pRVar59;
                      if ((pRVar59->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar59->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (auVar62 = local_3e8,
                          ((ulong)((RTCIntersectArguments *)((long)local_3e8 + 0x20))->intersect &
                          0x40000000000000) != 0)))) {
                        auVar64 = (undefined1  [8])local_2f8;
                        (*pRVar59->filter)((RTCFilterFunctionNArguments *)auVar64);
                        if (*(int *)local_2f8._0_8_ == 0) goto LAB_00b27b31;
                      }
                      puVar61 = (undefined1 *)CONCAT71((int7)((ulong)auVar62 >> 8),1);
                      ray = local_390;
                      break;
                    }
                    auVar64 = (undefined1  [8])local_2f8;
                    (**pp_Var52)((RTCFilterFunctionNArguments *)auVar64);
                    if (*(int *)local_2f8._0_8_ != 0) goto LAB_00b27ae9;
LAB_00b27b31:
                    local_390->tfar = (float)local_3b8;
                    local_468 = local_468 ^ 1L << (local_3d8 & 0x3f);
                    uVar56 = 0;
                    if (local_468 != 0) {
                      for (; (local_468 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                      }
                    }
                    puVar61 = (undefined1 *)0x0;
                    ray = local_390;
                    auVar64 = local_3e8;
                  } while (local_468 != 0);
                }
                bVar63 = (bool)(bVar63 | (byte)puVar61);
              }
            }
          }
          uVar57 = SUB84(puVar61,0);
          lVar65 = lVar65 + 4;
        } while ((int)lVar65 < iVar19);
      }
      if (bVar63 != false) {
        return bVar63;
      }
      fVar136 = ray->tfar;
      auVar124._4_4_ = -(uint)(fStack_44 <= fVar136);
      auVar124._0_4_ = -(uint)(local_48 <= fVar136);
      auVar124._8_4_ = -(uint)(fStack_40 <= fVar136);
      auVar124._12_4_ = -(uint)(fStack_3c <= fVar136);
      uVar67 = movmskps(uVar57,auVar124);
      uVar66 = uVar66 & uVar66 + 0xf & uVar67;
    } while (uVar66 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }